

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enter.hpp
# Opt level: O3

void __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::getEnterVals2(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *this,int leaveIdx,
               number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *enterMax,
               number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *leavebound,
               StableSum<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *objChange)

{
  uint *puVar1;
  bool bVar2;
  pointer pnVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  int iVar12;
  Status SVar13;
  cpp_dec_float<100U,_int,_void> *pcVar14;
  undefined8 uVar15;
  pointer pnVar16;
  cpp_dec_float<100U,_int,_void> *pcVar17;
  Status *pSVar18;
  undefined8 *puVar19;
  undefined1 uVar20;
  long lVar21;
  fpclass_type fVar22;
  cpp_dec_float<100U,_int,_void> *pcVar23;
  int32_t iVar24;
  long lVar25;
  long lVar26;
  long lVar27;
  uint uVar28;
  uint uVar29;
  uint uVar30;
  uint uVar31;
  uint uVar32;
  uint uVar33;
  uint uVar34;
  uint uVar35;
  uint uVar36;
  uint uVar37;
  uint uVar38;
  uint uVar39;
  uint uVar40;
  uint uVar41;
  uint uVar42;
  uint uVar43;
  type t;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  SPxId leftId;
  cpp_dec_float<100U,_int,_void> local_138;
  cpp_dec_float<100U,_int,_void> *local_e0;
  cpp_dec_float<100U,_int,_void> local_d8;
  cpp_dec_float<100U,_int,_void> local_88;
  DataKey local_38;
  
  lVar26 = (long)leaveIdx;
  local_38 = (this->
             super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).theBaseId.data[lVar26].super_DataKey;
  local_e0 = (cpp_dec_float<100U,_int,_void> *)objChange;
  if (local_38.info < 0) {
    SPxRowId::SPxRowId((SPxRowId *)&local_138,(SPxId *)&local_38);
    iVar12 = ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
             ::number(&(this->
                       super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).
                       super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .
                       super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .set,(DataKey *)&local_138);
    lVar25 = (long)iVar12;
    switch((this->
           super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).thedesc.rowstat.data[lVar25]) {
    case D_FREE:
      pnVar16 = (this->theFvec->thedelta).
                super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      local_d8.data._M_elems._0_8_ = *(undefined8 *)&pnVar16[lVar26].m_backend.data;
      local_d8.data._M_elems._8_8_ = *(undefined8 *)((long)&pnVar16[lVar26].m_backend.data + 8);
      puVar1 = (uint *)((long)&pnVar16[lVar26].m_backend.data + 0x10);
      local_d8.data._M_elems._16_8_ = *(undefined8 *)puVar1;
      local_d8.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
      puVar1 = (uint *)((long)&pnVar16[lVar26].m_backend.data + 0x20);
      local_d8.data._M_elems._32_8_ = *(undefined8 *)puVar1;
      local_d8.data._M_elems._40_8_ = *(undefined8 *)(puVar1 + 2);
      puVar1 = (uint *)((long)&pnVar16[lVar26].m_backend.data + 0x30);
      local_d8.data._M_elems._48_8_ = *(undefined8 *)puVar1;
      local_d8.data._M_elems._56_8_ = *(undefined8 *)(puVar1 + 2);
      local_d8.exp = pnVar16[lVar26].m_backend.exp;
      local_d8.neg = pnVar16[lVar26].m_backend.neg;
      local_d8.fpclass = pnVar16[lVar26].m_backend.fpclass;
      local_d8.prec_elem = pnVar16[lVar26].m_backend.prec_elem;
      local_88.fpclass = cpp_dec_float_finite;
      local_88.prec_elem = 0x10;
      local_88.data._M_elems[0] = 0;
      local_88.data._M_elems[1] = 0;
      local_88.data._M_elems[2] = 0;
      local_88.data._M_elems[3] = 0;
      local_88.data._M_elems[4] = 0;
      local_88.data._M_elems[5] = 0;
      local_88.data._M_elems[6] = 0;
      local_88.data._M_elems[7] = 0;
      local_88.data._M_elems[8] = 0;
      local_88.data._M_elems[9] = 0;
      local_88.data._M_elems[10] = 0;
      local_88.data._M_elems[0xb] = 0;
      local_88.data._M_elems[0xc] = 0;
      local_88.data._M_elems[0xd] = 0;
      local_88.data._M_elems._56_5_ = 0;
      local_88.data._M_elems[0xf]._1_3_ = 0;
      local_88.exp = 0;
      local_88.neg = false;
      if (&local_88 == &enterMax->m_backend) {
        enterMax = (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)&local_d8;
      }
      else {
        local_88.data._M_elems._56_5_ = local_d8.data._M_elems._56_5_;
        local_88.data._M_elems[0xf]._1_3_ = local_d8.data._M_elems[0xf]._1_3_;
        local_88.prec_elem = local_d8.prec_elem;
        local_88.fpclass = local_d8.fpclass;
        local_88.data._M_elems._0_8_ = local_d8.data._M_elems._0_8_;
        local_88.data._M_elems._8_8_ = local_d8.data._M_elems._8_8_;
        local_88.data._M_elems._16_8_ = local_d8.data._M_elems._16_8_;
        local_88.data._M_elems._24_8_ = local_d8.data._M_elems._24_8_;
        local_88.data._M_elems._32_8_ = local_d8.data._M_elems._32_8_;
        local_88.data._M_elems._40_8_ = local_d8.data._M_elems._40_8_;
        local_88.data._M_elems._48_8_ = local_d8.data._M_elems._48_8_;
        local_88.exp = local_d8.exp;
        local_88.neg = local_d8.neg;
      }
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator*=
                (&local_88,&enterMax->m_backend);
      if (local_88.fpclass == cpp_dec_float_NaN) {
LAB_003a3328:
        lVar27 = 0xc08;
      }
      else {
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<long_long>
                  (&local_138,0,(type *)0x0);
        iVar12 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                           (&local_88,&local_138);
        if (-1 < iVar12) goto LAB_003a3328;
        lVar27 = 0xbf0;
      }
      lVar27 = *(long *)((long)&(this->
                                super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                ).
                                super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                .
                                super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                .
                                super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                ._vptr_ClassArray + lVar27);
      lVar21 = lVar26 * 0x50;
      uVar4 = *(undefined8 *)(lVar27 + lVar21);
      uVar5 = ((undefined8 *)(lVar27 + lVar21))[1];
      puVar19 = (undefined8 *)(lVar27 + 0x10 + lVar21);
      uVar6 = *puVar19;
      uVar7 = puVar19[1];
      puVar19 = (undefined8 *)(lVar27 + 0x20 + lVar21);
      uVar8 = *puVar19;
      uVar9 = puVar19[1];
      puVar19 = (undefined8 *)(lVar27 + 0x30 + lVar21);
      uVar10 = *puVar19;
      uVar11 = puVar19[1];
      *(undefined8 *)((leavebound->m_backend).data._M_elems + 0xc) = uVar10;
      *(undefined8 *)((leavebound->m_backend).data._M_elems + 0xe) = uVar11;
      *(undefined8 *)((leavebound->m_backend).data._M_elems + 8) = uVar8;
      *(undefined8 *)((leavebound->m_backend).data._M_elems + 10) = uVar9;
      *(undefined8 *)((leavebound->m_backend).data._M_elems + 4) = uVar6;
      *(undefined8 *)((leavebound->m_backend).data._M_elems + 6) = uVar7;
      *(undefined8 *)(leavebound->m_backend).data._M_elems = uVar4;
      *(undefined8 *)((leavebound->m_backend).data._M_elems + 2) = uVar5;
      (leavebound->m_backend).exp = *(int *)(lVar27 + 0x40 + lVar21);
      (leavebound->m_backend).neg = *(bool *)(lVar27 + 0x44 + lVar21);
      uVar15 = *(undefined8 *)(lVar27 + 0x48 + lVar21);
      (leavebound->m_backend).fpclass = (int)uVar15;
      (leavebound->m_backend).prec_elem = (int)((ulong)uVar15 >> 0x20);
      pnVar16 = (this->theLRbound).val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      puVar1 = (uint *)((long)&pnVar16[lVar25].m_backend.data + 0x30);
      *(undefined8 *)puVar1 = uVar10;
      *(undefined8 *)(puVar1 + 2) = uVar11;
      puVar1 = (uint *)((long)&pnVar16[lVar25].m_backend.data + 0x20);
      *(undefined8 *)puVar1 = uVar8;
      *(undefined8 *)(puVar1 + 2) = uVar9;
      puVar1 = (uint *)((long)&pnVar16[lVar25].m_backend.data + 0x10);
      *(undefined8 *)puVar1 = uVar6;
      *(undefined8 *)(puVar1 + 2) = uVar7;
      *(undefined8 *)&pnVar16[lVar25].m_backend.data = uVar4;
      *(undefined8 *)((long)&pnVar16[lVar25].m_backend.data + 8) = uVar5;
      pnVar16[lVar25].m_backend.exp = (leavebound->m_backend).exp;
      pnVar16[lVar25].m_backend.neg = (leavebound->m_backend).neg;
      iVar24 = (leavebound->m_backend).prec_elem;
      pnVar16[lVar25].m_backend.fpclass = (leavebound->m_backend).fpclass;
      pnVar16[lVar25].m_backend.prec_elem = iVar24;
      pnVar16 = (this->theURbound).val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uVar15 = *(undefined8 *)(leavebound->m_backend).data._M_elems;
      uVar4 = *(undefined8 *)((leavebound->m_backend).data._M_elems + 2);
      uVar5 = *(undefined8 *)((leavebound->m_backend).data._M_elems + 4);
      uVar6 = *(undefined8 *)((leavebound->m_backend).data._M_elems + 6);
      uVar7 = *(undefined8 *)((leavebound->m_backend).data._M_elems + 8);
      uVar8 = *(undefined8 *)((leavebound->m_backend).data._M_elems + 10);
      uVar9 = *(undefined8 *)((leavebound->m_backend).data._M_elems + 0xe);
      puVar1 = (uint *)((long)&pnVar16[lVar25].m_backend.data + 0x30);
      *(undefined8 *)puVar1 = *(undefined8 *)((leavebound->m_backend).data._M_elems + 0xc);
      *(undefined8 *)(puVar1 + 2) = uVar9;
      puVar1 = (uint *)((long)&pnVar16[lVar25].m_backend.data + 0x20);
      *(undefined8 *)puVar1 = uVar7;
      *(undefined8 *)(puVar1 + 2) = uVar8;
      puVar1 = (uint *)((long)&pnVar16[lVar25].m_backend.data + 0x10);
      *(undefined8 *)puVar1 = uVar5;
      *(undefined8 *)(puVar1 + 2) = uVar6;
      *(undefined8 *)&pnVar16[lVar25].m_backend.data = uVar15;
      *(undefined8 *)((long)&pnVar16[lVar25].m_backend.data + 8) = uVar4;
      iVar12 = (leavebound->m_backend).exp;
      pnVar16[lVar25].m_backend.exp = iVar12;
      bVar2 = (leavebound->m_backend).neg;
      pnVar16[lVar25].m_backend.neg = bVar2;
      fVar22 = (leavebound->m_backend).fpclass;
      pnVar16[lVar25].m_backend.fpclass = fVar22;
      iVar24 = (leavebound->m_backend).prec_elem;
      pnVar16[lVar25].m_backend.prec_elem = iVar24;
      pcVar14 = &(this->
                 super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .object.val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar26].m_backend;
      local_138.fpclass = cpp_dec_float_finite;
      local_138.prec_elem = 0x10;
      local_138.data._M_elems[0] = 0;
      local_138.data._M_elems[1] = 0;
      local_138.data._M_elems[2] = 0;
      local_138.data._M_elems[3] = 0;
      local_138.data._M_elems[4] = 0;
      local_138.data._M_elems[5] = 0;
      local_138.data._M_elems[6] = 0;
      local_138.data._M_elems[7] = 0;
      local_138.data._M_elems[8] = 0;
      local_138.data._M_elems[9] = 0;
      local_138.data._M_elems[10] = 0;
      local_138.data._M_elems[0xb] = 0;
      local_138.data._M_elems[0xc] = 0;
      local_138.data._M_elems[0xd] = 0;
      local_138.data._M_elems._56_5_ = 0;
      local_138.data._M_elems[0xf]._1_3_ = 0;
      local_138.exp = 0;
      local_138.neg = false;
      pcVar17 = &leavebound->m_backend;
      if ((&local_138 != pcVar14) && (pcVar17 = pcVar14, &local_138 != &leavebound->m_backend)) {
        local_138.data._M_elems._0_8_ = *(undefined8 *)(leavebound->m_backend).data._M_elems;
        local_138.data._M_elems._8_8_ = *(undefined8 *)((leavebound->m_backend).data._M_elems + 2);
        local_138.data._M_elems._16_8_ = *(undefined8 *)((leavebound->m_backend).data._M_elems + 4);
        local_138.data._M_elems._24_8_ = *(undefined8 *)((leavebound->m_backend).data._M_elems + 6);
        local_138.data._M_elems._32_8_ = *(undefined8 *)((leavebound->m_backend).data._M_elems + 8);
        local_138.data._M_elems._40_8_ = *(undefined8 *)((leavebound->m_backend).data._M_elems + 10)
        ;
        local_138.data._M_elems._48_8_ =
             *(undefined8 *)((leavebound->m_backend).data._M_elems + 0xc);
        uVar15 = *(undefined8 *)((leavebound->m_backend).data._M_elems + 0xe);
        local_138.data._M_elems._56_5_ = SUB85(uVar15,0);
        local_138.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar15 >> 0x28);
        local_138.prec_elem = iVar24;
        local_138.fpclass = fVar22;
        local_138.exp = iVar12;
        local_138.neg = bVar2;
      }
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator*=
                (&local_138,pcVar17);
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
                (local_e0,&local_138);
      pSVar18 = (this->
                super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).thedesc.rowstat.data;
      goto LAB_003a37a8;
    case D_ON_UPPER:
      pnVar16 = (this->theUBbound).val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uVar15 = *(undefined8 *)&pnVar16[lVar26].m_backend.data;
      uVar4 = *(undefined8 *)((long)&pnVar16[lVar26].m_backend.data + 8);
      puVar1 = (uint *)((long)&pnVar16[lVar26].m_backend.data + 0x10);
      uVar5 = *(undefined8 *)puVar1;
      uVar6 = *(undefined8 *)(puVar1 + 2);
      puVar1 = (uint *)((long)&pnVar16[lVar26].m_backend.data + 0x20);
      uVar7 = *(undefined8 *)puVar1;
      uVar8 = *(undefined8 *)(puVar1 + 2);
      puVar1 = (uint *)((long)&pnVar16[lVar26].m_backend.data + 0x30);
      uVar9 = *(undefined8 *)puVar1;
      uVar10 = *(undefined8 *)(puVar1 + 2);
      *(undefined8 *)((leavebound->m_backend).data._M_elems + 0xc) = uVar9;
      *(undefined8 *)((leavebound->m_backend).data._M_elems + 0xe) = uVar10;
      *(undefined8 *)((leavebound->m_backend).data._M_elems + 8) = uVar7;
      *(undefined8 *)((leavebound->m_backend).data._M_elems + 10) = uVar8;
      *(undefined8 *)((leavebound->m_backend).data._M_elems + 4) = uVar5;
      *(undefined8 *)((leavebound->m_backend).data._M_elems + 6) = uVar6;
      *(undefined8 *)(leavebound->m_backend).data._M_elems = uVar15;
      *(undefined8 *)((leavebound->m_backend).data._M_elems + 2) = uVar4;
      (leavebound->m_backend).exp = pnVar16[lVar26].m_backend.exp;
      (leavebound->m_backend).neg = pnVar16[lVar26].m_backend.neg;
      iVar24 = pnVar16[lVar26].m_backend.prec_elem;
      (leavebound->m_backend).fpclass = pnVar16[lVar26].m_backend.fpclass;
      (leavebound->m_backend).prec_elem = iVar24;
      pnVar16 = (this->theURbound).val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      puVar1 = (uint *)((long)&pnVar16[lVar25].m_backend.data + 0x30);
      *(undefined8 *)puVar1 = uVar9;
      *(undefined8 *)(puVar1 + 2) = uVar10;
      puVar1 = (uint *)((long)&pnVar16[lVar25].m_backend.data + 0x20);
      *(undefined8 *)puVar1 = uVar7;
      *(undefined8 *)(puVar1 + 2) = uVar8;
      puVar1 = (uint *)((long)&pnVar16[lVar25].m_backend.data + 0x10);
      *(undefined8 *)puVar1 = uVar5;
      *(undefined8 *)(puVar1 + 2) = uVar6;
      *(undefined8 *)&pnVar16[lVar25].m_backend.data = uVar15;
      *(undefined8 *)((long)&pnVar16[lVar25].m_backend.data + 8) = uVar4;
      iVar12 = (leavebound->m_backend).exp;
      pnVar16[lVar25].m_backend.exp = iVar12;
      uVar20 = (leavebound->m_backend).neg;
      pnVar16[lVar25].m_backend.neg = (bool)uVar20;
      fVar22 = (leavebound->m_backend).fpclass;
      pnVar16[lVar25].m_backend.fpclass = fVar22;
      iVar24 = (leavebound->m_backend).prec_elem;
      pnVar16[lVar25].m_backend.prec_elem = iVar24;
      pcVar17 = &(this->
                 super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .object.val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar26].m_backend;
      if (&local_138 == pcVar17) {
LAB_003a3985:
        local_138.fpclass = cpp_dec_float_finite;
        local_138.prec_elem = 0x10;
        local_138.neg = false;
        local_138.exp = 0;
        local_138.data._M_elems[0xf]._1_3_ = 0;
        local_138.data._M_elems._56_5_ = 0;
        local_138.data._M_elems[0xc] = 0;
        local_138.data._M_elems[0xd] = 0;
        local_138.data._M_elems[10] = 0;
        local_138.data._M_elems[0xb] = 0;
        local_138.data._M_elems[8] = 0;
        local_138.data._M_elems[9] = 0;
        local_138.data._M_elems[6] = 0;
        local_138.data._M_elems[7] = 0;
        local_138.data._M_elems[4] = 0;
        local_138.data._M_elems[5] = 0;
        local_138.data._M_elems[2] = 0;
        local_138.data._M_elems[3] = 0;
        local_138.data._M_elems[0] = 0;
        local_138.data._M_elems[1] = 0;
        pcVar17 = &leavebound->m_backend;
      }
      else {
joined_r0x003a397d:
        local_138.neg = false;
        local_138.exp = 0;
        local_138.data._M_elems[0xf]._1_3_ = 0;
        local_138.data._M_elems._56_5_ = 0;
        local_138.data._M_elems[0xc] = 0;
        local_138.data._M_elems[0xd] = 0;
        local_138.data._M_elems[10] = 0;
        local_138.data._M_elems[0xb] = 0;
        local_138.data._M_elems[8] = 0;
        local_138.data._M_elems[9] = 0;
        local_138.data._M_elems[6] = 0;
        local_138.data._M_elems[7] = 0;
        local_138.data._M_elems[4] = 0;
        local_138.data._M_elems[5] = 0;
        local_138.data._M_elems[2] = 0;
        local_138.data._M_elems[3] = 0;
        local_138.data._M_elems[0] = 0;
        local_138.data._M_elems[1] = 0;
        local_138.fpclass = cpp_dec_float_finite;
        local_138.prec_elem = 0x10;
        if (&local_138 != &leavebound->m_backend) {
          local_138.data._M_elems._0_8_ = *(undefined8 *)(leavebound->m_backend).data._M_elems;
          local_138.data._M_elems._8_8_ = *(undefined8 *)((leavebound->m_backend).data._M_elems + 2)
          ;
          local_138.data._M_elems._16_8_ =
               *(undefined8 *)((leavebound->m_backend).data._M_elems + 4);
          local_138.data._M_elems._24_8_ =
               *(undefined8 *)((leavebound->m_backend).data._M_elems + 6);
          local_138.data._M_elems._32_8_ =
               *(undefined8 *)((leavebound->m_backend).data._M_elems + 8);
          local_138.data._M_elems._40_8_ =
               *(undefined8 *)((leavebound->m_backend).data._M_elems + 10);
          local_138.data._M_elems._48_8_ =
               *(undefined8 *)((leavebound->m_backend).data._M_elems + 0xc);
          uVar15 = *(undefined8 *)((leavebound->m_backend).data._M_elems + 0xe);
          local_138.data._M_elems._56_5_ = SUB85(uVar15,0);
          local_138.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar15 >> 0x28);
          local_138.prec_elem = iVar24;
          local_138.fpclass = fVar22;
          local_138.exp = iVar12;
          local_138.neg = (bool)uVar20;
        }
      }
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator*=
                (&local_138,pcVar17);
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
                (local_e0,&local_138);
      pSVar18 = (this->
                super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).thedesc.rowstat.data;
      goto LAB_003a39a7;
    case D_ON_LOWER:
      pnVar16 = (this->theLBbound).val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uVar15 = *(undefined8 *)&pnVar16[lVar26].m_backend.data;
      uVar4 = *(undefined8 *)((long)&pnVar16[lVar26].m_backend.data + 8);
      puVar1 = (uint *)((long)&pnVar16[lVar26].m_backend.data + 0x10);
      uVar5 = *(undefined8 *)puVar1;
      uVar6 = *(undefined8 *)(puVar1 + 2);
      puVar1 = (uint *)((long)&pnVar16[lVar26].m_backend.data + 0x20);
      uVar7 = *(undefined8 *)puVar1;
      uVar8 = *(undefined8 *)(puVar1 + 2);
      puVar1 = (uint *)((long)&pnVar16[lVar26].m_backend.data + 0x30);
      uVar9 = *(undefined8 *)puVar1;
      uVar10 = *(undefined8 *)(puVar1 + 2);
      *(undefined8 *)((leavebound->m_backend).data._M_elems + 0xc) = uVar9;
      *(undefined8 *)((leavebound->m_backend).data._M_elems + 0xe) = uVar10;
      *(undefined8 *)((leavebound->m_backend).data._M_elems + 8) = uVar7;
      *(undefined8 *)((leavebound->m_backend).data._M_elems + 10) = uVar8;
      *(undefined8 *)((leavebound->m_backend).data._M_elems + 4) = uVar5;
      *(undefined8 *)((leavebound->m_backend).data._M_elems + 6) = uVar6;
      *(undefined8 *)(leavebound->m_backend).data._M_elems = uVar15;
      *(undefined8 *)((leavebound->m_backend).data._M_elems + 2) = uVar4;
      (leavebound->m_backend).exp = pnVar16[lVar26].m_backend.exp;
      (leavebound->m_backend).neg = pnVar16[lVar26].m_backend.neg;
      iVar24 = pnVar16[lVar26].m_backend.prec_elem;
      (leavebound->m_backend).fpclass = pnVar16[lVar26].m_backend.fpclass;
      (leavebound->m_backend).prec_elem = iVar24;
      pnVar16 = (this->theLRbound).val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      puVar1 = (uint *)((long)&pnVar16[lVar25].m_backend.data + 0x30);
      *(undefined8 *)puVar1 = uVar9;
      *(undefined8 *)(puVar1 + 2) = uVar10;
      puVar1 = (uint *)((long)&pnVar16[lVar25].m_backend.data + 0x20);
      *(undefined8 *)puVar1 = uVar7;
      *(undefined8 *)(puVar1 + 2) = uVar8;
      puVar1 = (uint *)((long)&pnVar16[lVar25].m_backend.data + 0x10);
      *(undefined8 *)puVar1 = uVar5;
      *(undefined8 *)(puVar1 + 2) = uVar6;
      *(undefined8 *)&pnVar16[lVar25].m_backend.data = uVar15;
      *(undefined8 *)((long)&pnVar16[lVar25].m_backend.data + 8) = uVar4;
      iVar12 = (leavebound->m_backend).exp;
      pnVar16[lVar25].m_backend.exp = iVar12;
      uVar20 = (leavebound->m_backend).neg;
      pnVar16[lVar25].m_backend.neg = (bool)uVar20;
      fVar22 = (leavebound->m_backend).fpclass;
      pnVar16[lVar25].m_backend.fpclass = fVar22;
      iVar24 = (leavebound->m_backend).prec_elem;
      pnVar16[lVar25].m_backend.prec_elem = iVar24;
      pnVar16 = (this->
                super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .object.val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      goto LAB_003a30ab;
    case D_ON_BOTH:
      pnVar16 = (this->theFvec->thedelta).
                super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      local_d8.data._M_elems._0_8_ = *(undefined8 *)&pnVar16[lVar26].m_backend.data;
      local_d8.data._M_elems._8_8_ = *(undefined8 *)((long)&pnVar16[lVar26].m_backend.data + 8);
      puVar1 = (uint *)((long)&pnVar16[lVar26].m_backend.data + 0x10);
      local_d8.data._M_elems._16_8_ = *(undefined8 *)puVar1;
      local_d8.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
      puVar1 = (uint *)((long)&pnVar16[lVar26].m_backend.data + 0x20);
      local_d8.data._M_elems._32_8_ = *(undefined8 *)puVar1;
      local_d8.data._M_elems._40_8_ = *(undefined8 *)(puVar1 + 2);
      puVar1 = (uint *)((long)&pnVar16[lVar26].m_backend.data + 0x30);
      local_d8.data._M_elems._48_8_ = *(undefined8 *)puVar1;
      local_d8.data._M_elems._56_8_ = *(undefined8 *)(puVar1 + 2);
      local_d8.exp = pnVar16[lVar26].m_backend.exp;
      local_d8.neg = pnVar16[lVar26].m_backend.neg;
      local_d8.fpclass = pnVar16[lVar26].m_backend.fpclass;
      local_d8.prec_elem = pnVar16[lVar26].m_backend.prec_elem;
      local_88.fpclass = cpp_dec_float_finite;
      local_88.prec_elem = 0x10;
      local_88.data._M_elems[0] = 0;
      local_88.data._M_elems[1] = 0;
      local_88.data._M_elems[2] = 0;
      local_88.data._M_elems[3] = 0;
      local_88.data._M_elems[4] = 0;
      local_88.data._M_elems[5] = 0;
      local_88.data._M_elems[6] = 0;
      local_88.data._M_elems[7] = 0;
      local_88.data._M_elems[8] = 0;
      local_88.data._M_elems[9] = 0;
      local_88.data._M_elems[10] = 0;
      local_88.data._M_elems[0xb] = 0;
      local_88.data._M_elems[0xc] = 0;
      local_88.data._M_elems[0xd] = 0;
      local_88.data._M_elems._56_5_ = 0;
      local_88.data._M_elems[0xf]._1_3_ = 0;
      local_88.exp = 0;
      local_88.neg = false;
      if (&local_88 != &enterMax->m_backend) {
        local_88.data._M_elems._0_8_ = *(undefined8 *)(enterMax->m_backend).data._M_elems;
        local_88.data._M_elems._8_8_ = *(undefined8 *)((enterMax->m_backend).data._M_elems + 2);
        local_88.data._M_elems._16_8_ = *(undefined8 *)((enterMax->m_backend).data._M_elems + 4);
        local_88.data._M_elems._24_8_ = *(undefined8 *)((enterMax->m_backend).data._M_elems + 6);
        local_88.data._M_elems._32_8_ = *(undefined8 *)((enterMax->m_backend).data._M_elems + 8);
        local_88.data._M_elems._40_8_ = *(undefined8 *)((enterMax->m_backend).data._M_elems + 10);
        local_88.data._M_elems._48_8_ = *(undefined8 *)((enterMax->m_backend).data._M_elems + 0xc);
        uVar15 = *(undefined8 *)((enterMax->m_backend).data._M_elems + 0xe);
        local_88.data._M_elems._56_5_ = SUB85(uVar15,0);
        local_88.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar15 >> 0x28);
        local_88.exp = (enterMax->m_backend).exp;
        local_88.neg = (enterMax->m_backend).neg;
        local_88.fpclass = (enterMax->m_backend).fpclass;
        local_88.prec_elem = (enterMax->m_backend).prec_elem;
      }
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator*=
                (&local_88,&local_d8);
      if (local_88.fpclass != cpp_dec_float_NaN) {
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<long_long>
                  (&local_138,0,(type *)0x0);
        iVar12 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                           (&local_88,&local_138);
        if (iVar12 < 0) {
          pnVar16 = (this->theUBbound).val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          uVar15 = *(undefined8 *)&pnVar16[lVar26].m_backend.data;
          uVar4 = *(undefined8 *)((long)&pnVar16[lVar26].m_backend.data + 8);
          puVar1 = (uint *)((long)&pnVar16[lVar26].m_backend.data + 0x10);
          uVar5 = *(undefined8 *)puVar1;
          uVar6 = *(undefined8 *)(puVar1 + 2);
          puVar1 = (uint *)((long)&pnVar16[lVar26].m_backend.data + 0x20);
          uVar7 = *(undefined8 *)puVar1;
          uVar8 = *(undefined8 *)(puVar1 + 2);
          puVar1 = (uint *)((long)&pnVar16[lVar26].m_backend.data + 0x30);
          uVar9 = *(undefined8 *)puVar1;
          uVar10 = *(undefined8 *)(puVar1 + 2);
          *(undefined8 *)((leavebound->m_backend).data._M_elems + 0xc) = uVar9;
          *(undefined8 *)((leavebound->m_backend).data._M_elems + 0xe) = uVar10;
          *(undefined8 *)((leavebound->m_backend).data._M_elems + 8) = uVar7;
          *(undefined8 *)((leavebound->m_backend).data._M_elems + 10) = uVar8;
          *(undefined8 *)((leavebound->m_backend).data._M_elems + 4) = uVar5;
          *(undefined8 *)((leavebound->m_backend).data._M_elems + 6) = uVar6;
          *(undefined8 *)(leavebound->m_backend).data._M_elems = uVar15;
          *(undefined8 *)((leavebound->m_backend).data._M_elems + 2) = uVar4;
          (leavebound->m_backend).exp = pnVar16[lVar26].m_backend.exp;
          (leavebound->m_backend).neg = pnVar16[lVar26].m_backend.neg;
          iVar24 = pnVar16[lVar26].m_backend.prec_elem;
          (leavebound->m_backend).fpclass = pnVar16[lVar26].m_backend.fpclass;
          (leavebound->m_backend).prec_elem = iVar24;
          pnVar16 = (this->theURbound).val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          puVar1 = (uint *)((long)&pnVar16[lVar25].m_backend.data + 0x30);
          *(undefined8 *)puVar1 = uVar9;
          *(undefined8 *)(puVar1 + 2) = uVar10;
          puVar1 = (uint *)((long)&pnVar16[lVar25].m_backend.data + 0x20);
          *(undefined8 *)puVar1 = uVar7;
          *(undefined8 *)(puVar1 + 2) = uVar8;
          puVar1 = (uint *)((long)&pnVar16[lVar25].m_backend.data + 0x10);
          *(undefined8 *)puVar1 = uVar5;
          *(undefined8 *)(puVar1 + 2) = uVar6;
          *(undefined8 *)&pnVar16[lVar25].m_backend.data = uVar15;
          *(undefined8 *)((long)&pnVar16[lVar25].m_backend.data + 8) = uVar4;
          iVar12 = (leavebound->m_backend).exp;
          pnVar16[lVar25].m_backend.exp = iVar12;
          uVar20 = (leavebound->m_backend).neg;
          pnVar16[lVar25].m_backend.neg = (bool)uVar20;
          fVar22 = (leavebound->m_backend).fpclass;
          pnVar16[lVar25].m_backend.fpclass = fVar22;
          iVar24 = (leavebound->m_backend).prec_elem;
          pnVar16[lVar25].m_backend.prec_elem = iVar24;
          pcVar17 = &(this->
                     super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).
                     super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .object.val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[lVar26].m_backend;
          if (&local_138 == pcVar17) goto LAB_003a3985;
          goto joined_r0x003a397d;
        }
      }
      pnVar16 = (this->theLBbound).val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uVar15 = *(undefined8 *)&pnVar16[lVar26].m_backend.data;
      uVar4 = *(undefined8 *)((long)&pnVar16[lVar26].m_backend.data + 8);
      puVar1 = (uint *)((long)&pnVar16[lVar26].m_backend.data + 0x10);
      uVar5 = *(undefined8 *)puVar1;
      uVar6 = *(undefined8 *)(puVar1 + 2);
      puVar1 = (uint *)((long)&pnVar16[lVar26].m_backend.data + 0x20);
      uVar7 = *(undefined8 *)puVar1;
      uVar8 = *(undefined8 *)(puVar1 + 2);
      puVar1 = (uint *)((long)&pnVar16[lVar26].m_backend.data + 0x30);
      uVar9 = *(undefined8 *)puVar1;
      uVar10 = *(undefined8 *)(puVar1 + 2);
      *(undefined8 *)((leavebound->m_backend).data._M_elems + 0xc) = uVar9;
      *(undefined8 *)((leavebound->m_backend).data._M_elems + 0xe) = uVar10;
      *(undefined8 *)((leavebound->m_backend).data._M_elems + 8) = uVar7;
      *(undefined8 *)((leavebound->m_backend).data._M_elems + 10) = uVar8;
      *(undefined8 *)((leavebound->m_backend).data._M_elems + 4) = uVar5;
      *(undefined8 *)((leavebound->m_backend).data._M_elems + 6) = uVar6;
      *(undefined8 *)(leavebound->m_backend).data._M_elems = uVar15;
      *(undefined8 *)((leavebound->m_backend).data._M_elems + 2) = uVar4;
      (leavebound->m_backend).exp = pnVar16[lVar26].m_backend.exp;
      (leavebound->m_backend).neg = pnVar16[lVar26].m_backend.neg;
      iVar24 = pnVar16[lVar26].m_backend.prec_elem;
      (leavebound->m_backend).fpclass = pnVar16[lVar26].m_backend.fpclass;
      (leavebound->m_backend).prec_elem = iVar24;
      pnVar16 = (this->theLRbound).val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      puVar1 = (uint *)((long)&pnVar16[lVar25].m_backend.data + 0x30);
      *(undefined8 *)puVar1 = uVar9;
      *(undefined8 *)(puVar1 + 2) = uVar10;
      puVar1 = (uint *)((long)&pnVar16[lVar25].m_backend.data + 0x20);
      *(undefined8 *)puVar1 = uVar7;
      *(undefined8 *)(puVar1 + 2) = uVar8;
      puVar1 = (uint *)((long)&pnVar16[lVar25].m_backend.data + 0x10);
      *(undefined8 *)puVar1 = uVar5;
      *(undefined8 *)(puVar1 + 2) = uVar6;
      *(undefined8 *)&pnVar16[lVar25].m_backend.data = uVar15;
      *(undefined8 *)((long)&pnVar16[lVar25].m_backend.data + 8) = uVar4;
      iVar12 = (leavebound->m_backend).exp;
      pnVar16[lVar25].m_backend.exp = iVar12;
      uVar20 = (leavebound->m_backend).neg;
      pnVar16[lVar25].m_backend.neg = (bool)uVar20;
      fVar22 = (leavebound->m_backend).fpclass;
      pnVar16[lVar25].m_backend.fpclass = fVar22;
      iVar24 = (leavebound->m_backend).prec_elem;
      pnVar16[lVar25].m_backend.prec_elem = iVar24;
      pnVar16 = (this->
                super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .object.val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
LAB_003a30ab:
      pcVar14 = (cpp_dec_float<100U,_int,_void> *)((long)pnVar16 + lVar26 * 0x50);
      local_138.fpclass = cpp_dec_float_finite;
      local_138.prec_elem = 0x10;
      local_138.data._M_elems[0] = 0;
      local_138.data._M_elems[1] = 0;
      local_138.data._M_elems[2] = 0;
      local_138.data._M_elems[3] = 0;
      local_138.data._M_elems[4] = 0;
      local_138.data._M_elems[5] = 0;
      local_138.data._M_elems[6] = 0;
      local_138.data._M_elems[7] = 0;
      local_138.data._M_elems[8] = 0;
      local_138.data._M_elems[9] = 0;
      local_138.data._M_elems[10] = 0;
      local_138.data._M_elems[0xb] = 0;
      local_138.data._M_elems[0xc] = 0;
      local_138.data._M_elems[0xd] = 0;
      local_138.data._M_elems._56_5_ = 0;
      local_138.data._M_elems[0xf]._1_3_ = 0;
      local_138.exp = 0;
      local_138.neg = false;
      pcVar17 = &leavebound->m_backend;
      if ((&local_138 != pcVar14) && (pcVar17 = pcVar14, &local_138 != &leavebound->m_backend)) {
        local_138.data._M_elems._0_8_ = *(undefined8 *)(leavebound->m_backend).data._M_elems;
        local_138.data._M_elems._8_8_ = *(undefined8 *)((leavebound->m_backend).data._M_elems + 2);
        local_138.data._M_elems._16_8_ = *(undefined8 *)((leavebound->m_backend).data._M_elems + 4);
        local_138.data._M_elems._24_8_ = *(undefined8 *)((leavebound->m_backend).data._M_elems + 6);
        local_138.data._M_elems._32_8_ = *(undefined8 *)((leavebound->m_backend).data._M_elems + 8);
        local_138.data._M_elems._40_8_ = *(undefined8 *)((leavebound->m_backend).data._M_elems + 10)
        ;
        local_138.data._M_elems._48_8_ =
             *(undefined8 *)((leavebound->m_backend).data._M_elems + 0xc);
        uVar15 = *(undefined8 *)((leavebound->m_backend).data._M_elems + 0xe);
        local_138.data._M_elems._56_5_ = SUB85(uVar15,0);
        local_138.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar15 >> 0x28);
        local_138.prec_elem = iVar24;
        local_138.fpclass = fVar22;
        local_138.exp = iVar12;
        local_138.neg = (bool)uVar20;
      }
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator*=
                (&local_138,pcVar17);
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
                (local_e0,&local_138);
      pSVar18 = (this->
                super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).thedesc.rowstat.data;
LAB_003a35e2:
      pSVar18[lVar25] = P_ON_UPPER;
      return;
    case D_UNDEFINED:
      puVar19 = (undefined8 *)__cxa_allocate_exception(0x28);
      local_138.data._M_elems._0_8_ = local_138.data._M_elems + 4;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_138,"XENTER06 This should never happen.","");
      *puVar19 = &PTR__SPxException_0069d438;
      puVar19[1] = puVar19 + 3;
      std::__cxx11::string::_M_construct<char*>
                ((string *)(puVar19 + 1),local_138.data._M_elems._0_8_,
                 local_138.data._M_elems._0_8_ + local_138.data._M_elems._8_8_);
      *puVar19 = &PTR__SPxException_0069d410;
      __cxa_throw(puVar19,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
    case P_FIXED:
      puVar19 = (undefined8 *)__cxa_allocate_exception(0x28);
      local_138.data._M_elems._0_8_ = local_138.data._M_elems + 4;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_138,"XENTER04 This should never happen.","");
      *puVar19 = &PTR__SPxException_0069d438;
      puVar19[1] = puVar19 + 3;
      std::__cxx11::string::_M_construct<char*>
                ((string *)(puVar19 + 1),local_138.data._M_elems._0_8_,
                 local_138.data._M_elems._0_8_ + local_138.data._M_elems._8_8_);
      *puVar19 = &PTR__SPxException_0069d410;
      __cxa_throw(puVar19,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
    default:
      puVar19 = (undefined8 *)__cxa_allocate_exception(0x28);
      local_138.data._M_elems._0_8_ = local_138.data._M_elems + 4;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_138,"XENTER07 This should never happen.","");
      *puVar19 = &PTR__SPxException_0069d438;
      puVar19[1] = puVar19 + 3;
      std::__cxx11::string::_M_construct<char*>
                ((string *)(puVar19 + 1),local_138.data._M_elems._0_8_,
                 local_138.data._M_elems._0_8_ + local_138.data._M_elems._8_8_);
      *puVar19 = &PTR__SPxException_0069d410;
      __cxa_throw(puVar19,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
    case P_ON_LOWER:
      pnVar3 = (this->theUBbound).val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pnVar16 = pnVar3 + lVar26;
      uVar28 = (pnVar16->m_backend).data._M_elems[0];
      uVar29 = *(uint *)((long)&(pnVar16->m_backend).data + 4);
      uVar30 = *(uint *)((long)&(pnVar16->m_backend).data + 8);
      uVar31 = *(uint *)((long)&(pnVar16->m_backend).data + 0xc);
      puVar1 = (uint *)((long)&pnVar3[lVar26].m_backend.data + 0x10);
      uVar32 = *puVar1;
      uVar33 = puVar1[1];
      uVar34 = puVar1[2];
      uVar35 = puVar1[3];
      puVar1 = (uint *)((long)&pnVar3[lVar26].m_backend.data + 0x20);
      uVar36 = *puVar1;
      uVar37 = puVar1[1];
      uVar38 = puVar1[2];
      uVar39 = puVar1[3];
      puVar1 = (uint *)((long)&pnVar3[lVar26].m_backend.data + 0x30);
      uVar40 = *puVar1;
      uVar41 = puVar1[1];
      uVar42 = puVar1[2];
      uVar43 = puVar1[3];
      (leavebound->m_backend).data._M_elems[0xc] = uVar40;
      (leavebound->m_backend).data._M_elems[0xd] = uVar41;
      (leavebound->m_backend).data._M_elems[0xe] = uVar42;
      (leavebound->m_backend).data._M_elems[0xf] = uVar43;
      (leavebound->m_backend).data._M_elems[8] = uVar36;
      (leavebound->m_backend).data._M_elems[9] = uVar37;
      (leavebound->m_backend).data._M_elems[10] = uVar38;
      (leavebound->m_backend).data._M_elems[0xb] = uVar39;
      (leavebound->m_backend).data._M_elems[4] = uVar32;
      (leavebound->m_backend).data._M_elems[5] = uVar33;
      (leavebound->m_backend).data._M_elems[6] = uVar34;
      (leavebound->m_backend).data._M_elems[7] = uVar35;
      (leavebound->m_backend).data._M_elems[0] = uVar28;
      (leavebound->m_backend).data._M_elems[1] = uVar29;
      (leavebound->m_backend).data._M_elems[2] = uVar30;
      (leavebound->m_backend).data._M_elems[3] = uVar31;
      (leavebound->m_backend).exp = pnVar3[lVar26].m_backend.exp;
      (leavebound->m_backend).neg = pnVar3[lVar26].m_backend.neg;
      iVar24 = pnVar3[lVar26].m_backend.prec_elem;
      (leavebound->m_backend).fpclass = pnVar3[lVar26].m_backend.fpclass;
      (leavebound->m_backend).prec_elem = iVar24;
      pnVar16 = (this->theURbound).val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      break;
    case P_ON_UPPER:
      pnVar3 = (this->theLBbound).val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pnVar16 = pnVar3 + lVar26;
      uVar28 = (pnVar16->m_backend).data._M_elems[0];
      uVar29 = *(uint *)((long)&(pnVar16->m_backend).data + 4);
      uVar30 = *(uint *)((long)&(pnVar16->m_backend).data + 8);
      uVar31 = *(uint *)((long)&(pnVar16->m_backend).data + 0xc);
      puVar1 = (uint *)((long)&pnVar3[lVar26].m_backend.data + 0x10);
      uVar32 = *puVar1;
      uVar33 = puVar1[1];
      uVar34 = puVar1[2];
      uVar35 = puVar1[3];
      puVar1 = (uint *)((long)&pnVar3[lVar26].m_backend.data + 0x20);
      uVar36 = *puVar1;
      uVar37 = puVar1[1];
      uVar38 = puVar1[2];
      uVar39 = puVar1[3];
      puVar1 = (uint *)((long)&pnVar3[lVar26].m_backend.data + 0x30);
      uVar40 = *puVar1;
      uVar41 = puVar1[1];
      uVar42 = puVar1[2];
      uVar43 = puVar1[3];
      (leavebound->m_backend).data._M_elems[0xc] = uVar40;
      (leavebound->m_backend).data._M_elems[0xd] = uVar41;
      (leavebound->m_backend).data._M_elems[0xe] = uVar42;
      (leavebound->m_backend).data._M_elems[0xf] = uVar43;
      (leavebound->m_backend).data._M_elems[8] = uVar36;
      (leavebound->m_backend).data._M_elems[9] = uVar37;
      (leavebound->m_backend).data._M_elems[10] = uVar38;
      (leavebound->m_backend).data._M_elems[0xb] = uVar39;
      (leavebound->m_backend).data._M_elems[4] = uVar32;
      (leavebound->m_backend).data._M_elems[5] = uVar33;
      (leavebound->m_backend).data._M_elems[6] = uVar34;
      (leavebound->m_backend).data._M_elems[7] = uVar35;
      (leavebound->m_backend).data._M_elems[0] = uVar28;
      (leavebound->m_backend).data._M_elems[1] = uVar29;
      (leavebound->m_backend).data._M_elems[2] = uVar30;
      (leavebound->m_backend).data._M_elems[3] = uVar31;
      (leavebound->m_backend).exp = pnVar3[lVar26].m_backend.exp;
      (leavebound->m_backend).neg = pnVar3[lVar26].m_backend.neg;
      iVar24 = pnVar3[lVar26].m_backend.prec_elem;
      (leavebound->m_backend).fpclass = pnVar3[lVar26].m_backend.fpclass;
      (leavebound->m_backend).prec_elem = iVar24;
      pnVar16 = (this->theLRbound).val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      break;
    case P_FREE:
      puVar19 = (undefined8 *)__cxa_allocate_exception(0x28);
      local_138.data._M_elems._0_8_ = local_138.data._M_elems + 4;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_138,"XENTER05 This should never happen.","");
      *puVar19 = &PTR__SPxException_0069d438;
      puVar19[1] = puVar19 + 3;
      std::__cxx11::string::_M_construct<char*>
                ((string *)(puVar19 + 1),local_138.data._M_elems._0_8_,
                 local_138.data._M_elems._0_8_ + local_138.data._M_elems._8_8_);
      *puVar19 = &PTR__SPxException_0069d410;
      __cxa_throw(puVar19,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
    }
    puVar1 = (uint *)((long)&pnVar16[lVar25].m_backend.data + 0x30);
    *puVar1 = uVar40;
    puVar1[1] = uVar41;
    puVar1[2] = uVar42;
    puVar1[3] = uVar43;
    puVar1 = (uint *)((long)&pnVar16[lVar25].m_backend.data + 0x20);
    *puVar1 = uVar36;
    puVar1[1] = uVar37;
    puVar1[2] = uVar38;
    puVar1[3] = uVar39;
    puVar1 = (uint *)((long)&pnVar16[lVar25].m_backend.data + 0x10);
    *puVar1 = uVar32;
    puVar1[1] = uVar33;
    puVar1[2] = uVar34;
    puVar1[3] = uVar35;
    pnVar3 = pnVar16 + lVar25;
    (pnVar3->m_backend).data._M_elems[0] = uVar28;
    *(uint *)((long)&(pnVar3->m_backend).data + 4) = uVar29;
    *(uint *)((long)&(pnVar3->m_backend).data + 8) = uVar30;
    *(uint *)((long)&(pnVar3->m_backend).data + 0xc) = uVar31;
    pnVar16[lVar25].m_backend.exp = (leavebound->m_backend).exp;
    pnVar16[lVar25].m_backend.neg = (leavebound->m_backend).neg;
    iVar24 = (leavebound->m_backend).prec_elem;
    pnVar16[lVar25].m_backend.fpclass = (leavebound->m_backend).fpclass;
    pnVar16[lVar25].m_backend.prec_elem = iVar24;
    SVar13 = SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ::dualRowStatus(&this->
                              super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             ,iVar12);
    (this->
    super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ).thedesc.rowstat.data[lVar25] = SVar13;
    if (SVar13 == D_ON_BOTH) {
      pcVar14 = &(this->theURbound).val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar25].m_backend;
      pcVar23 = &(this->
                 super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .left.val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar25].m_backend;
      local_138.fpclass = cpp_dec_float_finite;
      local_138.prec_elem = 0x10;
      local_138.data._M_elems[0] = 0;
      local_138.data._M_elems[1] = 0;
      local_138.data._M_elems[2] = 0;
      local_138.data._M_elems[3] = 0;
      local_138.data._M_elems[4] = 0;
      local_138.data._M_elems[5] = 0;
      local_138.data._M_elems[6] = 0;
      local_138.data._M_elems[7] = 0;
      local_138.data._M_elems[8] = 0;
      local_138.data._M_elems[9] = 0;
      local_138.data._M_elems[10] = 0;
      local_138.data._M_elems[0xb] = 0;
      local_138.data._M_elems[0xc] = 0;
      local_138.data._M_elems[0xd] = 0;
      local_138.data._M_elems._56_5_ = 0;
      local_138.data._M_elems[0xf]._1_3_ = 0;
      local_138.exp = 0;
      local_138.neg = false;
      pcVar17 = pcVar14;
      if ((&local_138 != pcVar23) && (pcVar17 = pcVar23, &local_138 != pcVar14)) {
        local_138.data._M_elems._0_8_ = *(undefined8 *)(pcVar14->data)._M_elems;
        local_138.data._M_elems._8_8_ = *(undefined8 *)((pcVar14->data)._M_elems + 2);
        local_138.data._M_elems._16_8_ = *(undefined8 *)((pcVar14->data)._M_elems + 4);
        local_138.data._M_elems._24_8_ = *(undefined8 *)((pcVar14->data)._M_elems + 6);
        local_138.data._M_elems._32_8_ = *(undefined8 *)((pcVar14->data)._M_elems + 8);
        local_138.data._M_elems._40_8_ = *(undefined8 *)((pcVar14->data)._M_elems + 10);
        local_138.data._M_elems._48_8_ = *(undefined8 *)((pcVar14->data)._M_elems + 0xc);
        uVar15 = *(undefined8 *)((pcVar14->data)._M_elems + 0xe);
        local_138.data._M_elems._56_5_ = SUB85(uVar15,0);
        local_138.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar15 >> 0x28);
        local_138.exp = pcVar14->exp;
        local_138.neg = pcVar14->neg;
        local_138.fpclass = pcVar14->fpclass;
        local_138.prec_elem = pcVar14->prec_elem;
      }
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator*=
                (&local_138,pcVar17);
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
                (local_e0,&local_138);
      pcVar14 = &(this->theLRbound).val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar25].m_backend;
      pcVar23 = &(this->
                 super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .right.val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar25].m_backend;
      local_138.fpclass = cpp_dec_float_finite;
      local_138.prec_elem = 0x10;
      local_138.data._M_elems[0] = 0;
      local_138.data._M_elems[1] = 0;
      local_138.data._M_elems[2] = 0;
      local_138.data._M_elems[3] = 0;
      local_138.data._M_elems[4] = 0;
      local_138.data._M_elems[5] = 0;
      local_138.data._M_elems[6] = 0;
      local_138.data._M_elems[7] = 0;
      local_138.data._M_elems[8] = 0;
      local_138.data._M_elems[9] = 0;
      local_138.data._M_elems[10] = 0;
      local_138.data._M_elems[0xb] = 0;
      local_138.data._M_elems[0xc] = 0;
      local_138.data._M_elems[0xd] = 0;
      local_138.data._M_elems._56_5_ = 0;
      local_138.data._M_elems[0xf]._1_3_ = 0;
      local_138.exp = 0;
      local_138.neg = false;
      pcVar17 = pcVar14;
      if ((&local_138 != pcVar23) && (pcVar17 = pcVar23, &local_138 != pcVar14)) {
        local_138.data._M_elems._0_8_ = *(undefined8 *)(pcVar14->data)._M_elems;
        local_138.data._M_elems._8_8_ = *(undefined8 *)((pcVar14->data)._M_elems + 2);
        local_138.data._M_elems._16_8_ = *(undefined8 *)((pcVar14->data)._M_elems + 4);
        local_138.data._M_elems._24_8_ = *(undefined8 *)((pcVar14->data)._M_elems + 6);
        local_138.data._M_elems._32_8_ = *(undefined8 *)((pcVar14->data)._M_elems + 8);
        local_138.data._M_elems._40_8_ = *(undefined8 *)((pcVar14->data)._M_elems + 10);
        local_138.data._M_elems._48_8_ = *(undefined8 *)((pcVar14->data)._M_elems + 0xc);
        uVar15 = *(undefined8 *)((pcVar14->data)._M_elems + 0xe);
        local_138.data._M_elems._56_5_ = SUB85(uVar15,0);
        local_138.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar15 >> 0x28);
        local_138.exp = pcVar14->exp;
        local_138.neg = pcVar14->neg;
        local_138.fpclass = pcVar14->fpclass;
        local_138.prec_elem = pcVar14->prec_elem;
      }
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator*=
                (&local_138,pcVar17);
      pcVar17 = local_e0;
    }
    else {
      if (SVar13 == D_ON_LOWER) {
        pnVar3 = (this->theLRbound).val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pnVar16 = (this->
                  super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).
                  super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .right.val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      }
      else {
        if (SVar13 != D_ON_UPPER) {
          return;
        }
        pnVar3 = (this->theURbound).val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pnVar16 = (this->
                  super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).
                  super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .left.val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      }
      pcVar23 = (cpp_dec_float<100U,_int,_void> *)((long)pnVar16 + lVar25 * 0x50);
      pcVar14 = (cpp_dec_float<100U,_int,_void> *)((long)pnVar3 + lVar25 * 0x50);
      local_138.fpclass = cpp_dec_float_finite;
      local_138.prec_elem = 0x10;
      local_138.data._M_elems[0] = 0;
      local_138.data._M_elems[1] = 0;
      local_138.data._M_elems[2] = 0;
      local_138.data._M_elems[3] = 0;
      local_138.data._M_elems[4] = 0;
      local_138.data._M_elems[5] = 0;
      local_138.data._M_elems[6] = 0;
      local_138.data._M_elems[7] = 0;
      local_138.data._M_elems[8] = 0;
      local_138.data._M_elems[9] = 0;
      local_138.data._M_elems[10] = 0;
      local_138.data._M_elems[0xb] = 0;
      local_138.data._M_elems[0xc] = 0;
      local_138.data._M_elems[0xd] = 0;
      local_138.data._M_elems._56_5_ = 0;
      local_138.data._M_elems[0xf]._1_3_ = 0;
      local_138.exp = 0;
      local_138.neg = false;
      pcVar17 = pcVar14;
      if ((&local_138 != pcVar23) && (pcVar17 = pcVar23, &local_138 != pcVar14)) {
        local_138.data._M_elems._0_8_ = *(undefined8 *)(pcVar14->data)._M_elems;
        local_138.data._M_elems._8_8_ = *(undefined8 *)((pcVar14->data)._M_elems + 2);
        local_138.data._M_elems._16_8_ = *(undefined8 *)((pcVar14->data)._M_elems + 4);
        local_138.data._M_elems._24_8_ = *(undefined8 *)((pcVar14->data)._M_elems + 6);
        local_138.data._M_elems._32_8_ = *(undefined8 *)((pcVar14->data)._M_elems + 8);
        local_138.data._M_elems._40_8_ = *(undefined8 *)((pcVar14->data)._M_elems + 10);
        local_138.data._M_elems._48_8_ = *(undefined8 *)((pcVar14->data)._M_elems + 0xc);
        uVar15 = *(undefined8 *)((pcVar14->data)._M_elems + 0xe);
        local_138.data._M_elems._56_5_ = SUB85(uVar15,0);
        local_138.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar15 >> 0x28);
        local_138.exp = pcVar14->exp;
        local_138.neg = pcVar14->neg;
        local_138.fpclass = pcVar14->fpclass;
        local_138.prec_elem = pcVar14->prec_elem;
      }
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator*=
                (&local_138,pcVar17);
      pcVar17 = local_e0;
    }
    goto LAB_003a3a60;
  }
  SPxColId::SPxColId((SPxColId *)&local_138,(SPxId *)&local_38);
  iVar12 = ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
           ::number(&(this->
                     super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).
                     super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .
                     super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .set,(DataKey *)&local_138);
  lVar25 = (long)iVar12;
  switch((this->
         super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).thedesc.colstat.data[lVar25]) {
  case D_FREE:
    pnVar16 = (this->theFvec->thedelta).
              super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    lVar27 = lVar26 * 0x50;
    local_d8.data._M_elems._0_8_ = *(undefined8 *)&pnVar16[lVar26].m_backend.data;
    local_d8.data._M_elems._8_8_ = *(undefined8 *)((long)&pnVar16[lVar26].m_backend.data + 8);
    puVar1 = (uint *)((long)&pnVar16[lVar26].m_backend.data + 0x10);
    local_d8.data._M_elems._16_8_ = *(undefined8 *)puVar1;
    local_d8.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
    puVar1 = (uint *)((long)&pnVar16[lVar26].m_backend.data + 0x20);
    local_d8.data._M_elems._32_8_ = *(undefined8 *)puVar1;
    local_d8.data._M_elems._40_8_ = *(undefined8 *)(puVar1 + 2);
    puVar1 = (uint *)((long)&pnVar16[lVar26].m_backend.data + 0x30);
    local_d8.data._M_elems._48_8_ = *(undefined8 *)puVar1;
    local_d8.data._M_elems._56_8_ = *(undefined8 *)(puVar1 + 2);
    local_d8.exp = pnVar16[lVar26].m_backend.exp;
    local_d8.neg = pnVar16[lVar26].m_backend.neg;
    local_d8.fpclass = pnVar16[lVar26].m_backend.fpclass;
    local_d8.prec_elem = pnVar16[lVar26].m_backend.prec_elem;
    local_88.fpclass = cpp_dec_float_finite;
    local_88.prec_elem = 0x10;
    local_88.data._M_elems[0] = 0;
    local_88.data._M_elems[1] = 0;
    local_88.data._M_elems[2] = 0;
    local_88.data._M_elems[3] = 0;
    local_88.data._M_elems[4] = 0;
    local_88.data._M_elems[5] = 0;
    local_88.data._M_elems[6] = 0;
    local_88.data._M_elems[7] = 0;
    local_88.data._M_elems[8] = 0;
    local_88.data._M_elems[9] = 0;
    local_88.data._M_elems[10] = 0;
    local_88.data._M_elems[0xb] = 0;
    local_88.data._M_elems[0xc] = 0;
    local_88.data._M_elems[0xd] = 0;
    local_88.data._M_elems._56_5_ = 0;
    local_88.data._M_elems[0xf]._1_3_ = 0;
    local_88.exp = 0;
    local_88.neg = false;
    if (&local_88 == &enterMax->m_backend) {
      enterMax = (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)&local_d8;
    }
    else {
      local_88.data._M_elems._56_5_ = local_d8.data._M_elems._56_5_;
      local_88.data._M_elems[0xf]._1_3_ = local_d8.data._M_elems[0xf]._1_3_;
      local_88.prec_elem = local_d8.prec_elem;
      local_88.fpclass = local_d8.fpclass;
      local_88.data._M_elems._0_8_ = local_d8.data._M_elems._0_8_;
      local_88.data._M_elems._8_8_ = local_d8.data._M_elems._8_8_;
      local_88.data._M_elems._16_8_ = local_d8.data._M_elems._16_8_;
      local_88.data._M_elems._24_8_ = local_d8.data._M_elems._24_8_;
      local_88.data._M_elems._32_8_ = local_d8.data._M_elems._32_8_;
      local_88.data._M_elems._40_8_ = local_d8.data._M_elems._40_8_;
      local_88.data._M_elems._48_8_ = local_d8.data._M_elems._48_8_;
      local_88.exp = local_d8.exp;
      local_88.neg = local_d8.neg;
    }
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator*=
              (&local_88,&enterMax->m_backend);
    if (local_88.fpclass == cpp_dec_float_NaN) {
LAB_003a3651:
      lVar26 = 0xbf0;
    }
    else {
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<long_long>
                (&local_138,0,(type *)0x0);
      iVar12 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                         (&local_88,&local_138);
      lVar26 = 0xc08;
      if (iVar12 < 1) goto LAB_003a3651;
    }
    lVar26 = *(long *)((long)&(this->
                              super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              ).
                              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              .
                              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              .
                              super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._vptr_ClassArray + lVar26);
    uVar4 = *(undefined8 *)(lVar26 + lVar27);
    uVar5 = ((undefined8 *)(lVar26 + lVar27))[1];
    puVar19 = (undefined8 *)(lVar26 + 0x10 + lVar27);
    uVar6 = *puVar19;
    uVar7 = puVar19[1];
    puVar19 = (undefined8 *)(lVar26 + 0x20 + lVar27);
    uVar8 = *puVar19;
    uVar9 = puVar19[1];
    puVar19 = (undefined8 *)(lVar26 + 0x30 + lVar27);
    uVar10 = *puVar19;
    uVar11 = puVar19[1];
    *(undefined8 *)((leavebound->m_backend).data._M_elems + 0xc) = uVar10;
    *(undefined8 *)((leavebound->m_backend).data._M_elems + 0xe) = uVar11;
    *(undefined8 *)((leavebound->m_backend).data._M_elems + 8) = uVar8;
    *(undefined8 *)((leavebound->m_backend).data._M_elems + 10) = uVar9;
    *(undefined8 *)((leavebound->m_backend).data._M_elems + 4) = uVar6;
    *(undefined8 *)((leavebound->m_backend).data._M_elems + 6) = uVar7;
    *(undefined8 *)(leavebound->m_backend).data._M_elems = uVar4;
    *(undefined8 *)((leavebound->m_backend).data._M_elems + 2) = uVar5;
    (leavebound->m_backend).exp = *(int *)(lVar26 + 0x40 + lVar27);
    (leavebound->m_backend).neg = *(bool *)(lVar26 + 0x44 + lVar27);
    uVar15 = *(undefined8 *)(lVar26 + 0x48 + lVar27);
    (leavebound->m_backend).fpclass = (int)uVar15;
    (leavebound->m_backend).prec_elem = (int)((ulong)uVar15 >> 0x20);
    pnVar16 = (this->theLCbound).val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    puVar1 = (uint *)((long)&pnVar16[lVar25].m_backend.data + 0x30);
    *(undefined8 *)puVar1 = uVar10;
    *(undefined8 *)(puVar1 + 2) = uVar11;
    puVar1 = (uint *)((long)&pnVar16[lVar25].m_backend.data + 0x20);
    *(undefined8 *)puVar1 = uVar8;
    *(undefined8 *)(puVar1 + 2) = uVar9;
    puVar1 = (uint *)((long)&pnVar16[lVar25].m_backend.data + 0x10);
    *(undefined8 *)puVar1 = uVar6;
    *(undefined8 *)(puVar1 + 2) = uVar7;
    *(undefined8 *)&pnVar16[lVar25].m_backend.data = uVar4;
    *(undefined8 *)((long)&pnVar16[lVar25].m_backend.data + 8) = uVar5;
    pnVar16[lVar25].m_backend.exp = (leavebound->m_backend).exp;
    pnVar16[lVar25].m_backend.neg = (leavebound->m_backend).neg;
    iVar24 = (leavebound->m_backend).prec_elem;
    pnVar16[lVar25].m_backend.fpclass = (leavebound->m_backend).fpclass;
    pnVar16[lVar25].m_backend.prec_elem = iVar24;
    pnVar3 = (this->theUCbound).val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    puVar1 = (uint *)((long)&pnVar3[lVar25].m_backend.data + 0x30);
    *(undefined8 *)puVar1 = uVar10;
    *(undefined8 *)(puVar1 + 2) = uVar11;
    puVar1 = (uint *)((long)&pnVar3[lVar25].m_backend.data + 0x20);
    *(undefined8 *)puVar1 = uVar8;
    *(undefined8 *)(puVar1 + 2) = uVar9;
    puVar1 = (uint *)((long)&pnVar3[lVar25].m_backend.data + 0x10);
    *(undefined8 *)puVar1 = uVar6;
    *(undefined8 *)(puVar1 + 2) = uVar7;
    *(undefined8 *)&pnVar3[lVar25].m_backend.data = uVar4;
    *(undefined8 *)((long)&pnVar3[lVar25].m_backend.data + 8) = uVar5;
    pnVar3[lVar25].m_backend.exp = pnVar16[lVar25].m_backend.exp;
    pnVar3[lVar25].m_backend.neg = pnVar16[lVar25].m_backend.neg;
    iVar24 = pnVar16[lVar25].m_backend.prec_elem;
    pnVar3[lVar25].m_backend.fpclass = pnVar16[lVar25].m_backend.fpclass;
    pnVar3[lVar25].m_backend.prec_elem = iVar24;
    pcVar14 = &(this->
               super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .object.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start[lVar25].m_backend;
    local_138.fpclass = cpp_dec_float_finite;
    local_138.prec_elem = 0x10;
    local_138.data._M_elems[0] = 0;
    local_138.data._M_elems[1] = 0;
    local_138.data._M_elems[2] = 0;
    local_138.data._M_elems[3] = 0;
    local_138.data._M_elems[4] = 0;
    local_138.data._M_elems[5] = 0;
    local_138.data._M_elems[6] = 0;
    local_138.data._M_elems[7] = 0;
    local_138.data._M_elems[8] = 0;
    local_138.data._M_elems[9] = 0;
    local_138.data._M_elems[10] = 0;
    local_138.data._M_elems[0xb] = 0;
    local_138.data._M_elems[0xc] = 0;
    local_138.data._M_elems[0xd] = 0;
    local_138.data._M_elems._56_5_ = 0;
    local_138.data._M_elems[0xf]._1_3_ = 0;
    local_138.exp = 0;
    local_138.neg = false;
    pcVar17 = pcVar14;
    if ((&local_138 != &leavebound->m_backend) &&
       (pcVar17 = &leavebound->m_backend, &local_138 != pcVar14)) {
      local_138.data._M_elems._0_8_ =
           *(undefined8 *)(((cpp_dec_float<100U,_int,_void> *)&pcVar14->data)->data)._M_elems;
      local_138.data._M_elems._8_8_ =
           *(undefined8 *)((((cpp_dec_float<100U,_int,_void> *)&pcVar14->data)->data)._M_elems + 2);
      local_138.data._M_elems._16_8_ =
           *(undefined8 *)((((cpp_dec_float<100U,_int,_void> *)&pcVar14->data)->data)._M_elems + 4);
      local_138.data._M_elems._24_8_ =
           *(undefined8 *)((((cpp_dec_float<100U,_int,_void> *)&pcVar14->data)->data)._M_elems + 6);
      local_138.data._M_elems._32_8_ =
           *(undefined8 *)((((cpp_dec_float<100U,_int,_void> *)&pcVar14->data)->data)._M_elems + 8);
      local_138.data._M_elems._40_8_ =
           *(undefined8 *)((((cpp_dec_float<100U,_int,_void> *)&pcVar14->data)->data)._M_elems + 10)
      ;
      local_138.data._M_elems._48_8_ =
           *(undefined8 *)
            ((((cpp_dec_float<100U,_int,_void> *)&pcVar14->data)->data)._M_elems + 0xc);
      uVar15 = *(undefined8 *)
                ((((cpp_dec_float<100U,_int,_void> *)&pcVar14->data)->data)._M_elems + 0xe);
      local_138.data._M_elems._56_5_ = SUB85(uVar15,0);
      local_138.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar15 >> 0x28);
      local_138.exp = pcVar14->exp;
      local_138.neg = pcVar14->neg;
      local_138.fpclass = pcVar14->fpclass;
      local_138.prec_elem = pcVar14->prec_elem;
    }
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator*=(&local_138,pcVar17);
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=(local_e0,&local_138)
    ;
    pSVar18 = (this->
              super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).thedesc.colstat.data;
LAB_003a37a8:
    pSVar18[lVar25] = P_FIXED;
    return;
  case D_ON_UPPER:
    pnVar3 = (this->theLBbound).val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pnVar16 = pnVar3 + lVar26;
    uVar28 = (pnVar16->m_backend).data._M_elems[0];
    uVar29 = *(uint *)((long)&(pnVar16->m_backend).data + 4);
    uVar30 = *(uint *)((long)&(pnVar16->m_backend).data + 8);
    uVar31 = *(uint *)((long)&(pnVar16->m_backend).data + 0xc);
    puVar1 = (uint *)((long)&pnVar3[lVar26].m_backend.data + 0x10);
    uVar32 = *puVar1;
    uVar33 = puVar1[1];
    uVar34 = puVar1[2];
    uVar35 = puVar1[3];
    puVar1 = (uint *)((long)&pnVar3[lVar26].m_backend.data + 0x20);
    uVar36 = *puVar1;
    uVar37 = puVar1[1];
    uVar38 = puVar1[2];
    uVar39 = puVar1[3];
    puVar1 = (uint *)((long)&pnVar3[lVar26].m_backend.data + 0x30);
    uVar40 = *puVar1;
    uVar41 = puVar1[1];
    uVar42 = puVar1[2];
    uVar43 = puVar1[3];
    (leavebound->m_backend).data._M_elems[0xc] = uVar40;
    (leavebound->m_backend).data._M_elems[0xd] = uVar41;
    (leavebound->m_backend).data._M_elems[0xe] = uVar42;
    (leavebound->m_backend).data._M_elems[0xf] = uVar43;
    (leavebound->m_backend).data._M_elems[8] = uVar36;
    (leavebound->m_backend).data._M_elems[9] = uVar37;
    (leavebound->m_backend).data._M_elems[10] = uVar38;
    (leavebound->m_backend).data._M_elems[0xb] = uVar39;
    (leavebound->m_backend).data._M_elems[4] = uVar32;
    (leavebound->m_backend).data._M_elems[5] = uVar33;
    (leavebound->m_backend).data._M_elems[6] = uVar34;
    (leavebound->m_backend).data._M_elems[7] = uVar35;
    (leavebound->m_backend).data._M_elems[0] = uVar28;
    (leavebound->m_backend).data._M_elems[1] = uVar29;
    (leavebound->m_backend).data._M_elems[2] = uVar30;
    (leavebound->m_backend).data._M_elems[3] = uVar31;
    (leavebound->m_backend).exp = pnVar3[lVar26].m_backend.exp;
    (leavebound->m_backend).neg = pnVar3[lVar26].m_backend.neg;
    uVar15._0_4_ = pnVar3[lVar26].m_backend.fpclass;
    uVar15._4_4_ = pnVar3[lVar26].m_backend.prec_elem;
    goto LAB_003a2a09;
  case D_ON_LOWER:
    pnVar16 = (this->theUBbound).val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    uVar15 = *(undefined8 *)&pnVar16[lVar26].m_backend.data;
    uVar4 = *(undefined8 *)((long)&pnVar16[lVar26].m_backend.data + 8);
    puVar1 = (uint *)((long)&pnVar16[lVar26].m_backend.data + 0x10);
    uVar5 = *(undefined8 *)puVar1;
    uVar6 = *(undefined8 *)(puVar1 + 2);
    puVar1 = (uint *)((long)&pnVar16[lVar26].m_backend.data + 0x20);
    uVar7 = *(undefined8 *)puVar1;
    uVar8 = *(undefined8 *)(puVar1 + 2);
    puVar1 = (uint *)((long)&pnVar16[lVar26].m_backend.data + 0x30);
    uVar9 = *(undefined8 *)puVar1;
    uVar10 = *(undefined8 *)(puVar1 + 2);
    *(undefined8 *)((leavebound->m_backend).data._M_elems + 0xc) = uVar9;
    *(undefined8 *)((leavebound->m_backend).data._M_elems + 0xe) = uVar10;
    *(undefined8 *)((leavebound->m_backend).data._M_elems + 8) = uVar7;
    *(undefined8 *)((leavebound->m_backend).data._M_elems + 10) = uVar8;
    *(undefined8 *)((leavebound->m_backend).data._M_elems + 4) = uVar5;
    *(undefined8 *)((leavebound->m_backend).data._M_elems + 6) = uVar6;
    *(undefined8 *)(leavebound->m_backend).data._M_elems = uVar15;
    *(undefined8 *)((leavebound->m_backend).data._M_elems + 2) = uVar4;
    (leavebound->m_backend).exp = pnVar16[lVar26].m_backend.exp;
    (leavebound->m_backend).neg = pnVar16[lVar26].m_backend.neg;
    iVar24 = pnVar16[lVar26].m_backend.prec_elem;
    (leavebound->m_backend).fpclass = pnVar16[lVar26].m_backend.fpclass;
    (leavebound->m_backend).prec_elem = iVar24;
    pnVar16 = (this->theUCbound).val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    puVar1 = (uint *)((long)&pnVar16[lVar25].m_backend.data + 0x30);
    *(undefined8 *)puVar1 = uVar9;
    *(undefined8 *)(puVar1 + 2) = uVar10;
    puVar1 = (uint *)((long)&pnVar16[lVar25].m_backend.data + 0x20);
    *(undefined8 *)puVar1 = uVar7;
    *(undefined8 *)(puVar1 + 2) = uVar8;
    puVar1 = (uint *)((long)&pnVar16[lVar25].m_backend.data + 0x10);
    *(undefined8 *)puVar1 = uVar5;
    *(undefined8 *)(puVar1 + 2) = uVar6;
    *(undefined8 *)&pnVar16[lVar25].m_backend.data = uVar15;
    *(undefined8 *)((long)&pnVar16[lVar25].m_backend.data + 8) = uVar4;
    pnVar16[lVar25].m_backend.exp = (leavebound->m_backend).exp;
    pnVar16[lVar25].m_backend.neg = (leavebound->m_backend).neg;
    iVar24 = (leavebound->m_backend).prec_elem;
    pnVar16[lVar25].m_backend.fpclass = (leavebound->m_backend).fpclass;
    pnVar16[lVar25].m_backend.prec_elem = iVar24;
    pcVar17 = &(this->
               super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .object.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start[lVar25].m_backend;
    local_138.fpclass = cpp_dec_float_finite;
    local_138.prec_elem = 0x10;
    local_138.data._M_elems[0] = 0;
    local_138.data._M_elems[1] = 0;
    local_138.data._M_elems[2] = 0;
    local_138.data._M_elems[3] = 0;
    local_138.data._M_elems[4] = 0;
    local_138.data._M_elems[5] = 0;
    local_138.data._M_elems[6] = 0;
    local_138.data._M_elems[7] = 0;
    local_138.data._M_elems[8] = 0;
    local_138.data._M_elems[9] = 0;
    local_138.data._M_elems[10] = 0;
    local_138.data._M_elems[0xb] = 0;
    local_138.data._M_elems[0xc] = 0;
    local_138.data._M_elems[0xd] = 0;
    local_138.data._M_elems._56_5_ = 0;
    local_138.data._M_elems[0xf]._1_3_ = 0;
    local_138.exp = 0;
    local_138.neg = false;
    if (&local_138 == &leavebound->m_backend) {
LAB_003a35bd:
      local_138.fpclass = cpp_dec_float_finite;
      local_138.prec_elem = 0x10;
      local_138.neg = false;
      local_138.exp = 0;
      local_138.data._M_elems[0xf]._1_3_ = 0;
      local_138.data._M_elems._56_5_ = 0;
      local_138.data._M_elems[0xc] = 0;
      local_138.data._M_elems[0xd] = 0;
      local_138.data._M_elems[10] = 0;
      local_138.data._M_elems[0xb] = 0;
      local_138.data._M_elems[8] = 0;
      local_138.data._M_elems[9] = 0;
      local_138.data._M_elems[6] = 0;
      local_138.data._M_elems[7] = 0;
      local_138.data._M_elems[4] = 0;
      local_138.data._M_elems[5] = 0;
      local_138.data._M_elems[2] = 0;
      local_138.data._M_elems[3] = 0;
      local_138.data._M_elems[0] = 0;
      local_138.data._M_elems[1] = 0;
      leavebound = (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)pcVar17;
    }
    else if (&local_138 != pcVar17) {
LAB_003a3582:
      local_138.data._M_elems._0_8_ =
           *(undefined8 *)(((cpp_dec_float<100U,_int,_void> *)&pcVar17->data)->data)._M_elems;
      local_138.data._M_elems._8_8_ =
           *(undefined8 *)((((cpp_dec_float<100U,_int,_void> *)&pcVar17->data)->data)._M_elems + 2);
      local_138.data._M_elems._16_8_ =
           *(undefined8 *)((((cpp_dec_float<100U,_int,_void> *)&pcVar17->data)->data)._M_elems + 4);
      local_138.data._M_elems._24_8_ =
           *(undefined8 *)((((cpp_dec_float<100U,_int,_void> *)&pcVar17->data)->data)._M_elems + 6);
      local_138.data._M_elems._32_8_ =
           *(undefined8 *)((((cpp_dec_float<100U,_int,_void> *)&pcVar17->data)->data)._M_elems + 8);
      local_138.data._M_elems._40_8_ =
           *(undefined8 *)((((cpp_dec_float<100U,_int,_void> *)&pcVar17->data)->data)._M_elems + 10)
      ;
      local_138.data._M_elems._48_8_ =
           *(undefined8 *)
            ((((cpp_dec_float<100U,_int,_void> *)&pcVar17->data)->data)._M_elems + 0xc);
      uVar15 = *(undefined8 *)
                ((((cpp_dec_float<100U,_int,_void> *)&pcVar17->data)->data)._M_elems + 0xe);
      local_138.data._M_elems._56_5_ = SUB85(uVar15,0);
      local_138.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar15 >> 0x28);
      local_138.exp = pcVar17->exp;
      local_138.neg = pcVar17->neg;
      local_138.fpclass = pcVar17->fpclass;
      local_138.prec_elem = pcVar17->prec_elem;
    }
LAB_003a35c0:
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator*=
              (&local_138,&leavebound->m_backend);
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=(local_e0,&local_138)
    ;
    pSVar18 = (this->
              super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).thedesc.colstat.data;
    goto LAB_003a35e2;
  case D_ON_BOTH:
  case D_UNDEFINED:
    pnVar16 = (this->theFvec->thedelta).
              super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    local_d8.data._M_elems._0_8_ = *(undefined8 *)&pnVar16[lVar26].m_backend.data;
    local_d8.data._M_elems._8_8_ = *(undefined8 *)((long)&pnVar16[lVar26].m_backend.data + 8);
    puVar1 = (uint *)((long)&pnVar16[lVar26].m_backend.data + 0x10);
    local_d8.data._M_elems._16_8_ = *(undefined8 *)puVar1;
    local_d8.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
    puVar1 = (uint *)((long)&pnVar16[lVar26].m_backend.data + 0x20);
    local_d8.data._M_elems._32_8_ = *(undefined8 *)puVar1;
    local_d8.data._M_elems._40_8_ = *(undefined8 *)(puVar1 + 2);
    puVar1 = (uint *)((long)&pnVar16[lVar26].m_backend.data + 0x30);
    local_d8.data._M_elems._48_8_ = *(undefined8 *)puVar1;
    local_d8.data._M_elems._56_8_ = *(undefined8 *)(puVar1 + 2);
    local_d8.exp = pnVar16[lVar26].m_backend.exp;
    local_d8.neg = pnVar16[lVar26].m_backend.neg;
    local_d8.fpclass = pnVar16[lVar26].m_backend.fpclass;
    local_d8.prec_elem = pnVar16[lVar26].m_backend.prec_elem;
    local_88.fpclass = cpp_dec_float_finite;
    local_88.prec_elem = 0x10;
    local_88.data._M_elems[0] = 0;
    local_88.data._M_elems[1] = 0;
    local_88.data._M_elems[2] = 0;
    local_88.data._M_elems[3] = 0;
    local_88.data._M_elems[4] = 0;
    local_88.data._M_elems[5] = 0;
    local_88.data._M_elems[6] = 0;
    local_88.data._M_elems[7] = 0;
    local_88.data._M_elems[8] = 0;
    local_88.data._M_elems[9] = 0;
    local_88.data._M_elems[10] = 0;
    local_88.data._M_elems[0xb] = 0;
    local_88.data._M_elems[0xc] = 0;
    local_88.data._M_elems[0xd] = 0;
    local_88.data._M_elems._56_5_ = 0;
    local_88.data._M_elems[0xf]._1_3_ = 0;
    local_88.exp = 0;
    local_88.neg = false;
    if (&local_88 != &enterMax->m_backend) {
      local_88.data._M_elems._0_8_ = *(undefined8 *)(enterMax->m_backend).data._M_elems;
      local_88.data._M_elems._8_8_ = *(undefined8 *)((enterMax->m_backend).data._M_elems + 2);
      local_88.data._M_elems._16_8_ = *(undefined8 *)((enterMax->m_backend).data._M_elems + 4);
      local_88.data._M_elems._24_8_ = *(undefined8 *)((enterMax->m_backend).data._M_elems + 6);
      local_88.data._M_elems._32_8_ = *(undefined8 *)((enterMax->m_backend).data._M_elems + 8);
      local_88.data._M_elems._40_8_ = *(undefined8 *)((enterMax->m_backend).data._M_elems + 10);
      local_88.data._M_elems._48_8_ = *(undefined8 *)((enterMax->m_backend).data._M_elems + 0xc);
      uVar15 = *(undefined8 *)((enterMax->m_backend).data._M_elems + 0xe);
      local_88.data._M_elems._56_5_ = SUB85(uVar15,0);
      local_88.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar15 >> 0x28);
      local_88.exp = (enterMax->m_backend).exp;
      local_88.neg = (enterMax->m_backend).neg;
      local_88.fpclass = (enterMax->m_backend).fpclass;
      local_88.prec_elem = (enterMax->m_backend).prec_elem;
    }
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator*=(&local_88,&local_d8)
    ;
    if (local_88.fpclass != cpp_dec_float_NaN) {
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<long_long>
                (&local_138,0,(type *)0x0);
      iVar12 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                         (&local_88,&local_138);
      if (iVar12 < 0) {
        pnVar16 = (this->theUBbound).val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        uVar15 = *(undefined8 *)&pnVar16[lVar26].m_backend.data;
        uVar4 = *(undefined8 *)((long)&pnVar16[lVar26].m_backend.data + 8);
        puVar1 = (uint *)((long)&pnVar16[lVar26].m_backend.data + 0x10);
        uVar5 = *(undefined8 *)puVar1;
        uVar6 = *(undefined8 *)(puVar1 + 2);
        puVar1 = (uint *)((long)&pnVar16[lVar26].m_backend.data + 0x20);
        uVar7 = *(undefined8 *)puVar1;
        uVar8 = *(undefined8 *)(puVar1 + 2);
        puVar1 = (uint *)((long)&pnVar16[lVar26].m_backend.data + 0x30);
        uVar9 = *(undefined8 *)puVar1;
        uVar10 = *(undefined8 *)(puVar1 + 2);
        *(undefined8 *)((leavebound->m_backend).data._M_elems + 0xc) = uVar9;
        *(undefined8 *)((leavebound->m_backend).data._M_elems + 0xe) = uVar10;
        *(undefined8 *)((leavebound->m_backend).data._M_elems + 8) = uVar7;
        *(undefined8 *)((leavebound->m_backend).data._M_elems + 10) = uVar8;
        *(undefined8 *)((leavebound->m_backend).data._M_elems + 4) = uVar5;
        *(undefined8 *)((leavebound->m_backend).data._M_elems + 6) = uVar6;
        *(undefined8 *)(leavebound->m_backend).data._M_elems = uVar15;
        *(undefined8 *)((leavebound->m_backend).data._M_elems + 2) = uVar4;
        (leavebound->m_backend).exp = pnVar16[lVar26].m_backend.exp;
        (leavebound->m_backend).neg = pnVar16[lVar26].m_backend.neg;
        iVar24 = pnVar16[lVar26].m_backend.prec_elem;
        (leavebound->m_backend).fpclass = pnVar16[lVar26].m_backend.fpclass;
        (leavebound->m_backend).prec_elem = iVar24;
        pnVar16 = (this->theUCbound).val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        puVar1 = (uint *)((long)&pnVar16[lVar25].m_backend.data + 0x30);
        *(undefined8 *)puVar1 = uVar9;
        *(undefined8 *)(puVar1 + 2) = uVar10;
        puVar1 = (uint *)((long)&pnVar16[lVar25].m_backend.data + 0x20);
        *(undefined8 *)puVar1 = uVar7;
        *(undefined8 *)(puVar1 + 2) = uVar8;
        puVar1 = (uint *)((long)&pnVar16[lVar25].m_backend.data + 0x10);
        *(undefined8 *)puVar1 = uVar5;
        *(undefined8 *)(puVar1 + 2) = uVar6;
        *(undefined8 *)&pnVar16[lVar25].m_backend.data = uVar15;
        *(undefined8 *)((long)&pnVar16[lVar25].m_backend.data + 8) = uVar4;
        pnVar16[lVar25].m_backend.exp = (leavebound->m_backend).exp;
        pnVar16[lVar25].m_backend.neg = (leavebound->m_backend).neg;
        iVar24 = (leavebound->m_backend).prec_elem;
        pnVar16[lVar25].m_backend.fpclass = (leavebound->m_backend).fpclass;
        pnVar16[lVar25].m_backend.prec_elem = iVar24;
        pcVar17 = &(this->
                   super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).
                   super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .object.val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[lVar25].m_backend;
        local_138.fpclass = cpp_dec_float_finite;
        local_138.prec_elem = 0x10;
        local_138.data._M_elems[0] = 0;
        local_138.data._M_elems[1] = 0;
        local_138.data._M_elems[2] = 0;
        local_138.data._M_elems[3] = 0;
        local_138.data._M_elems[4] = 0;
        local_138.data._M_elems[5] = 0;
        local_138.data._M_elems[6] = 0;
        local_138.data._M_elems[7] = 0;
        local_138.data._M_elems[8] = 0;
        local_138.data._M_elems[9] = 0;
        local_138.data._M_elems[10] = 0;
        local_138.data._M_elems[0xb] = 0;
        local_138.data._M_elems[0xc] = 0;
        local_138.data._M_elems[0xd] = 0;
        local_138.data._M_elems._56_5_ = 0;
        local_138.data._M_elems[0xf]._1_3_ = 0;
        local_138.exp = 0;
        local_138.neg = false;
        if (&local_138 == &leavebound->m_backend) goto LAB_003a35bd;
        if (&local_138 != pcVar17) goto LAB_003a3582;
        goto LAB_003a35c0;
      }
    }
    pnVar3 = (this->theLBbound).val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pnVar16 = pnVar3 + lVar26;
    uVar28 = (pnVar16->m_backend).data._M_elems[0];
    uVar29 = *(uint *)((long)&(pnVar16->m_backend).data + 4);
    uVar30 = *(uint *)((long)&(pnVar16->m_backend).data + 8);
    uVar31 = *(uint *)((long)&(pnVar16->m_backend).data + 0xc);
    puVar1 = (uint *)((long)&pnVar3[lVar26].m_backend.data + 0x10);
    uVar32 = *puVar1;
    uVar33 = puVar1[1];
    uVar34 = puVar1[2];
    uVar35 = puVar1[3];
    puVar1 = (uint *)((long)&pnVar3[lVar26].m_backend.data + 0x20);
    uVar36 = *puVar1;
    uVar37 = puVar1[1];
    uVar38 = puVar1[2];
    uVar39 = puVar1[3];
    puVar1 = (uint *)((long)&pnVar3[lVar26].m_backend.data + 0x30);
    uVar40 = *puVar1;
    uVar41 = puVar1[1];
    uVar42 = puVar1[2];
    uVar43 = puVar1[3];
    (leavebound->m_backend).data._M_elems[0xc] = uVar40;
    (leavebound->m_backend).data._M_elems[0xd] = uVar41;
    (leavebound->m_backend).data._M_elems[0xe] = uVar42;
    (leavebound->m_backend).data._M_elems[0xf] = uVar43;
    (leavebound->m_backend).data._M_elems[8] = uVar36;
    (leavebound->m_backend).data._M_elems[9] = uVar37;
    (leavebound->m_backend).data._M_elems[10] = uVar38;
    (leavebound->m_backend).data._M_elems[0xb] = uVar39;
    (leavebound->m_backend).data._M_elems[4] = uVar32;
    (leavebound->m_backend).data._M_elems[5] = uVar33;
    (leavebound->m_backend).data._M_elems[6] = uVar34;
    (leavebound->m_backend).data._M_elems[7] = uVar35;
    (leavebound->m_backend).data._M_elems[0] = uVar28;
    (leavebound->m_backend).data._M_elems[1] = uVar29;
    (leavebound->m_backend).data._M_elems[2] = uVar30;
    (leavebound->m_backend).data._M_elems[3] = uVar31;
    (leavebound->m_backend).exp = pnVar3[lVar26].m_backend.exp;
    (leavebound->m_backend).neg = pnVar3[lVar26].m_backend.neg;
    uVar15._0_4_ = pnVar3[lVar26].m_backend.fpclass;
    uVar15._4_4_ = pnVar3[lVar26].m_backend.prec_elem;
LAB_003a2a09:
    (leavebound->m_backend).fpclass = (int)uVar15;
    (leavebound->m_backend).prec_elem = (int)((ulong)uVar15 >> 0x20);
    pnVar3 = (this->theLCbound).val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    puVar1 = (uint *)((long)&pnVar3[lVar25].m_backend.data + 0x30);
    *puVar1 = uVar40;
    puVar1[1] = uVar41;
    puVar1[2] = uVar42;
    puVar1[3] = uVar43;
    puVar1 = (uint *)((long)&pnVar3[lVar25].m_backend.data + 0x20);
    *puVar1 = uVar36;
    puVar1[1] = uVar37;
    puVar1[2] = uVar38;
    puVar1[3] = uVar39;
    puVar1 = (uint *)((long)&pnVar3[lVar25].m_backend.data + 0x10);
    *puVar1 = uVar32;
    puVar1[1] = uVar33;
    puVar1[2] = uVar34;
    puVar1[3] = uVar35;
    pnVar16 = pnVar3 + lVar25;
    (pnVar16->m_backend).data._M_elems[0] = uVar28;
    *(uint *)((long)&(pnVar16->m_backend).data + 4) = uVar29;
    *(uint *)((long)&(pnVar16->m_backend).data + 8) = uVar30;
    *(uint *)((long)&(pnVar16->m_backend).data + 0xc) = uVar31;
    pnVar3[lVar25].m_backend.exp = (leavebound->m_backend).exp;
    pnVar3[lVar25].m_backend.neg = (leavebound->m_backend).neg;
    iVar24 = (leavebound->m_backend).prec_elem;
    pnVar3[lVar25].m_backend.fpclass = (leavebound->m_backend).fpclass;
    pnVar3[lVar25].m_backend.prec_elem = iVar24;
    pcVar14 = &(this->
               super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .object.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start[lVar25].m_backend;
    local_138.fpclass = cpp_dec_float_finite;
    local_138.prec_elem = 0x10;
    local_138.data._M_elems[0] = 0;
    local_138.data._M_elems[1] = 0;
    local_138.data._M_elems[2] = 0;
    local_138.data._M_elems[3] = 0;
    local_138.data._M_elems[4] = 0;
    local_138.data._M_elems[5] = 0;
    local_138.data._M_elems[6] = 0;
    local_138.data._M_elems[7] = 0;
    local_138.data._M_elems[8] = 0;
    local_138.data._M_elems[9] = 0;
    local_138.data._M_elems[10] = 0;
    local_138.data._M_elems[0xb] = 0;
    local_138.data._M_elems[0xc] = 0;
    local_138.data._M_elems[0xd] = 0;
    local_138.data._M_elems._56_5_ = 0;
    local_138.data._M_elems[0xf]._1_3_ = 0;
    local_138.exp = 0;
    local_138.neg = false;
    pcVar17 = pcVar14;
    if ((&local_138 != &leavebound->m_backend) &&
       (pcVar17 = &leavebound->m_backend, &local_138 != pcVar14)) {
      local_138.data._M_elems._0_8_ =
           *(undefined8 *)(((cpp_dec_float<100U,_int,_void> *)&pcVar14->data)->data)._M_elems;
      local_138.data._M_elems._8_8_ =
           *(undefined8 *)((((cpp_dec_float<100U,_int,_void> *)&pcVar14->data)->data)._M_elems + 2);
      local_138.data._M_elems._16_8_ =
           *(undefined8 *)((((cpp_dec_float<100U,_int,_void> *)&pcVar14->data)->data)._M_elems + 4);
      local_138.data._M_elems._24_8_ =
           *(undefined8 *)((((cpp_dec_float<100U,_int,_void> *)&pcVar14->data)->data)._M_elems + 6);
      local_138.data._M_elems._32_8_ =
           *(undefined8 *)((((cpp_dec_float<100U,_int,_void> *)&pcVar14->data)->data)._M_elems + 8);
      local_138.data._M_elems._40_8_ =
           *(undefined8 *)((((cpp_dec_float<100U,_int,_void> *)&pcVar14->data)->data)._M_elems + 10)
      ;
      local_138.data._M_elems._48_8_ =
           *(undefined8 *)
            ((((cpp_dec_float<100U,_int,_void> *)&pcVar14->data)->data)._M_elems + 0xc);
      uVar15 = *(undefined8 *)
                ((((cpp_dec_float<100U,_int,_void> *)&pcVar14->data)->data)._M_elems + 0xe);
      local_138.data._M_elems._56_5_ = SUB85(uVar15,0);
      local_138.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar15 >> 0x28);
      local_138.exp = pcVar14->exp;
      local_138.neg = pcVar14->neg;
      local_138.fpclass = pcVar14->fpclass;
      local_138.prec_elem = pcVar14->prec_elem;
    }
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator*=(&local_138,pcVar17);
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=(local_e0,&local_138)
    ;
    pSVar18 = (this->
              super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).thedesc.colstat.data;
LAB_003a39a7:
    pSVar18[lVar25] = P_ON_LOWER;
    return;
  case P_FIXED:
    puVar19 = (undefined8 *)__cxa_allocate_exception(0x28);
    local_138.data._M_elems._0_8_ = local_138.data._M_elems + 4;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_138,"XENTER08 This should never happen.","");
    *puVar19 = &PTR__SPxException_0069d438;
    puVar19[1] = puVar19 + 3;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(puVar19 + 1),local_138.data._M_elems._0_8_,
               local_138.data._M_elems._0_8_ + local_138.data._M_elems._8_8_);
    *puVar19 = &PTR__SPxException_0069d410;
    __cxa_throw(puVar19,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
  default:
    puVar19 = (undefined8 *)__cxa_allocate_exception(0x28);
    local_138.data._M_elems._0_8_ = local_138.data._M_elems + 4;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_138,"XENTER09 This should never happen.","");
    *puVar19 = &PTR__SPxException_0069d438;
    puVar19[1] = puVar19 + 3;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(puVar19 + 1),local_138.data._M_elems._0_8_,
               local_138.data._M_elems._0_8_ + local_138.data._M_elems._8_8_);
    *puVar19 = &PTR__SPxException_0069d410;
    __cxa_throw(puVar19,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
  case P_ON_LOWER:
    pnVar3 = (this->theUBbound).val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pnVar16 = pnVar3 + lVar26;
    uVar28 = (pnVar16->m_backend).data._M_elems[0];
    uVar29 = *(uint *)((long)&(pnVar16->m_backend).data + 4);
    uVar30 = *(uint *)((long)&(pnVar16->m_backend).data + 8);
    uVar31 = *(uint *)((long)&(pnVar16->m_backend).data + 0xc);
    puVar1 = (uint *)((long)&pnVar3[lVar26].m_backend.data + 0x10);
    uVar32 = *puVar1;
    uVar33 = puVar1[1];
    uVar34 = puVar1[2];
    uVar35 = puVar1[3];
    puVar1 = (uint *)((long)&pnVar3[lVar26].m_backend.data + 0x20);
    uVar36 = *puVar1;
    uVar37 = puVar1[1];
    uVar38 = puVar1[2];
    uVar39 = puVar1[3];
    puVar1 = (uint *)((long)&pnVar3[lVar26].m_backend.data + 0x30);
    uVar40 = *puVar1;
    uVar41 = puVar1[1];
    uVar42 = puVar1[2];
    uVar43 = puVar1[3];
    (leavebound->m_backend).data._M_elems[0xc] = uVar40;
    (leavebound->m_backend).data._M_elems[0xd] = uVar41;
    (leavebound->m_backend).data._M_elems[0xe] = uVar42;
    (leavebound->m_backend).data._M_elems[0xf] = uVar43;
    (leavebound->m_backend).data._M_elems[8] = uVar36;
    (leavebound->m_backend).data._M_elems[9] = uVar37;
    (leavebound->m_backend).data._M_elems[10] = uVar38;
    (leavebound->m_backend).data._M_elems[0xb] = uVar39;
    (leavebound->m_backend).data._M_elems[4] = uVar32;
    (leavebound->m_backend).data._M_elems[5] = uVar33;
    (leavebound->m_backend).data._M_elems[6] = uVar34;
    (leavebound->m_backend).data._M_elems[7] = uVar35;
    (leavebound->m_backend).data._M_elems[0] = uVar28;
    (leavebound->m_backend).data._M_elems[1] = uVar29;
    (leavebound->m_backend).data._M_elems[2] = uVar30;
    (leavebound->m_backend).data._M_elems[3] = uVar31;
    (leavebound->m_backend).exp = pnVar3[lVar26].m_backend.exp;
    (leavebound->m_backend).neg = pnVar3[lVar26].m_backend.neg;
    iVar24 = pnVar3[lVar26].m_backend.prec_elem;
    (leavebound->m_backend).fpclass = pnVar3[lVar26].m_backend.fpclass;
    (leavebound->m_backend).prec_elem = iVar24;
    pnVar16 = (this->theUCbound).val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    break;
  case P_ON_UPPER:
    pnVar3 = (this->theLBbound).val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pnVar16 = pnVar3 + lVar26;
    uVar28 = (pnVar16->m_backend).data._M_elems[0];
    uVar29 = *(uint *)((long)&(pnVar16->m_backend).data + 4);
    uVar30 = *(uint *)((long)&(pnVar16->m_backend).data + 8);
    uVar31 = *(uint *)((long)&(pnVar16->m_backend).data + 0xc);
    puVar1 = (uint *)((long)&pnVar3[lVar26].m_backend.data + 0x10);
    uVar32 = *puVar1;
    uVar33 = puVar1[1];
    uVar34 = puVar1[2];
    uVar35 = puVar1[3];
    puVar1 = (uint *)((long)&pnVar3[lVar26].m_backend.data + 0x20);
    uVar36 = *puVar1;
    uVar37 = puVar1[1];
    uVar38 = puVar1[2];
    uVar39 = puVar1[3];
    puVar1 = (uint *)((long)&pnVar3[lVar26].m_backend.data + 0x30);
    uVar40 = *puVar1;
    uVar41 = puVar1[1];
    uVar42 = puVar1[2];
    uVar43 = puVar1[3];
    (leavebound->m_backend).data._M_elems[0xc] = uVar40;
    (leavebound->m_backend).data._M_elems[0xd] = uVar41;
    (leavebound->m_backend).data._M_elems[0xe] = uVar42;
    (leavebound->m_backend).data._M_elems[0xf] = uVar43;
    (leavebound->m_backend).data._M_elems[8] = uVar36;
    (leavebound->m_backend).data._M_elems[9] = uVar37;
    (leavebound->m_backend).data._M_elems[10] = uVar38;
    (leavebound->m_backend).data._M_elems[0xb] = uVar39;
    (leavebound->m_backend).data._M_elems[4] = uVar32;
    (leavebound->m_backend).data._M_elems[5] = uVar33;
    (leavebound->m_backend).data._M_elems[6] = uVar34;
    (leavebound->m_backend).data._M_elems[7] = uVar35;
    (leavebound->m_backend).data._M_elems[0] = uVar28;
    (leavebound->m_backend).data._M_elems[1] = uVar29;
    (leavebound->m_backend).data._M_elems[2] = uVar30;
    (leavebound->m_backend).data._M_elems[3] = uVar31;
    (leavebound->m_backend).exp = pnVar3[lVar26].m_backend.exp;
    (leavebound->m_backend).neg = pnVar3[lVar26].m_backend.neg;
    iVar24 = pnVar3[lVar26].m_backend.prec_elem;
    (leavebound->m_backend).fpclass = pnVar3[lVar26].m_backend.fpclass;
    (leavebound->m_backend).prec_elem = iVar24;
    pnVar16 = (this->theLCbound).val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    break;
  case P_FREE:
    pnVar16 = (this->theFvec->thedelta).
              super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    lVar27 = lVar26 * 0x50;
    local_d8.data._M_elems._0_8_ = *(undefined8 *)&pnVar16[lVar26].m_backend.data;
    local_d8.data._M_elems._8_8_ = *(undefined8 *)((long)&pnVar16[lVar26].m_backend.data + 8);
    puVar1 = (uint *)((long)&pnVar16[lVar26].m_backend.data + 0x10);
    local_d8.data._M_elems._16_8_ = *(undefined8 *)puVar1;
    local_d8.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
    puVar1 = (uint *)((long)&pnVar16[lVar26].m_backend.data + 0x20);
    local_d8.data._M_elems._32_8_ = *(undefined8 *)puVar1;
    local_d8.data._M_elems._40_8_ = *(undefined8 *)(puVar1 + 2);
    puVar1 = (uint *)((long)&pnVar16[lVar26].m_backend.data + 0x30);
    local_d8.data._M_elems._48_8_ = *(undefined8 *)puVar1;
    local_d8.data._M_elems._56_8_ = *(undefined8 *)(puVar1 + 2);
    local_d8.exp = pnVar16[lVar26].m_backend.exp;
    local_d8.neg = pnVar16[lVar26].m_backend.neg;
    local_d8.fpclass = pnVar16[lVar26].m_backend.fpclass;
    local_d8.prec_elem = pnVar16[lVar26].m_backend.prec_elem;
    local_88.fpclass = cpp_dec_float_finite;
    local_88.prec_elem = 0x10;
    local_88.data._M_elems[0] = 0;
    local_88.data._M_elems[1] = 0;
    local_88.data._M_elems[2] = 0;
    local_88.data._M_elems[3] = 0;
    local_88.data._M_elems[4] = 0;
    local_88.data._M_elems[5] = 0;
    local_88.data._M_elems[6] = 0;
    local_88.data._M_elems[7] = 0;
    local_88.data._M_elems[8] = 0;
    local_88.data._M_elems[9] = 0;
    local_88.data._M_elems[10] = 0;
    local_88.data._M_elems[0xb] = 0;
    local_88.data._M_elems[0xc] = 0;
    local_88.data._M_elems[0xd] = 0;
    local_88.data._M_elems._56_5_ = 0;
    local_88.data._M_elems[0xf]._1_3_ = 0;
    local_88.exp = 0;
    local_88.neg = false;
    if (&local_88 == &enterMax->m_backend) {
      enterMax = (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)&local_d8;
    }
    else {
      local_88.data._M_elems._56_5_ = local_d8.data._M_elems._56_5_;
      local_88.data._M_elems[0xf]._1_3_ = local_d8.data._M_elems[0xf]._1_3_;
      local_88.prec_elem = local_d8.prec_elem;
      local_88.fpclass = local_d8.fpclass;
      local_88.data._M_elems._0_8_ = local_d8.data._M_elems._0_8_;
      local_88.data._M_elems._8_8_ = local_d8.data._M_elems._8_8_;
      local_88.data._M_elems._16_8_ = local_d8.data._M_elems._16_8_;
      local_88.data._M_elems._24_8_ = local_d8.data._M_elems._24_8_;
      local_88.data._M_elems._32_8_ = local_d8.data._M_elems._32_8_;
      local_88.data._M_elems._40_8_ = local_d8.data._M_elems._40_8_;
      local_88.data._M_elems._48_8_ = local_d8.data._M_elems._48_8_;
      local_88.exp = local_d8.exp;
      local_88.neg = local_d8.neg;
    }
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator*=
              (&local_88,&enterMax->m_backend);
    if (local_88.fpclass != cpp_dec_float_NaN) {
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<long_long>
                (&local_138,0,(type *)0x0);
      iVar12 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                         (&local_88,&local_138);
      if (0 < iVar12) {
        lVar26 = 0xbd8;
        lVar21 = 0xc08;
        goto LAB_003a380c;
      }
    }
    lVar26 = 0xbc0;
    lVar21 = 0xbf0;
LAB_003a380c:
    lVar21 = *(long *)((long)&(this->
                              super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              ).
                              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              .
                              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              .
                              super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._vptr_ClassArray + lVar21);
    uVar4 = *(undefined8 *)(lVar21 + lVar27);
    uVar5 = ((undefined8 *)(lVar21 + lVar27))[1];
    puVar19 = (undefined8 *)(lVar21 + 0x10 + lVar27);
    uVar6 = *puVar19;
    uVar7 = puVar19[1];
    puVar19 = (undefined8 *)(lVar21 + 0x20 + lVar27);
    uVar8 = *puVar19;
    uVar9 = puVar19[1];
    puVar19 = (undefined8 *)(lVar21 + 0x30 + lVar27);
    uVar10 = *puVar19;
    uVar11 = puVar19[1];
    *(undefined8 *)((leavebound->m_backend).data._M_elems + 0xc) = uVar10;
    *(undefined8 *)((leavebound->m_backend).data._M_elems + 0xe) = uVar11;
    *(undefined8 *)((leavebound->m_backend).data._M_elems + 8) = uVar8;
    *(undefined8 *)((leavebound->m_backend).data._M_elems + 10) = uVar9;
    *(undefined8 *)((leavebound->m_backend).data._M_elems + 4) = uVar6;
    *(undefined8 *)((leavebound->m_backend).data._M_elems + 6) = uVar7;
    *(undefined8 *)(leavebound->m_backend).data._M_elems = uVar4;
    *(undefined8 *)((leavebound->m_backend).data._M_elems + 2) = uVar5;
    (leavebound->m_backend).exp = *(int *)(lVar21 + 0x40 + lVar27);
    (leavebound->m_backend).neg = *(bool *)(lVar21 + 0x44 + lVar27);
    uVar15 = *(undefined8 *)(lVar21 + 0x48 + lVar27);
    (leavebound->m_backend).fpclass = (int)uVar15;
    (leavebound->m_backend).prec_elem = (int)((ulong)uVar15 >> 0x20);
    lVar26 = *(long *)((long)&(this->
                              super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              ).
                              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              .
                              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              .
                              super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._vptr_ClassArray + lVar26);
    lVar27 = lVar25 * 0x50;
    puVar19 = (undefined8 *)(lVar26 + 0x30 + lVar27);
    *puVar19 = uVar10;
    puVar19[1] = uVar11;
    puVar19 = (undefined8 *)(lVar26 + 0x20 + lVar27);
    *puVar19 = uVar8;
    puVar19[1] = uVar9;
    puVar19 = (undefined8 *)(lVar26 + 0x10 + lVar27);
    *puVar19 = uVar6;
    puVar19[1] = uVar7;
    *(undefined8 *)(lVar26 + lVar27) = uVar4;
    ((undefined8 *)(lVar26 + lVar27))[1] = uVar5;
    *(int *)(lVar26 + 0x40 + lVar27) = (leavebound->m_backend).exp;
    *(bool *)(lVar26 + 0x44 + lVar27) = (leavebound->m_backend).neg;
    *(undefined8 *)(lVar26 + 0x48 + lVar27) = *(undefined8 *)&(leavebound->m_backend).fpclass;
    (this->
    super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ).thedesc.colstat.data[lVar25] = D_UNDEFINED;
    return;
  }
  puVar1 = (uint *)((long)&pnVar16[lVar25].m_backend.data + 0x30);
  *puVar1 = uVar40;
  puVar1[1] = uVar41;
  puVar1[2] = uVar42;
  puVar1[3] = uVar43;
  puVar1 = (uint *)((long)&pnVar16[lVar25].m_backend.data + 0x20);
  *puVar1 = uVar36;
  puVar1[1] = uVar37;
  puVar1[2] = uVar38;
  puVar1[3] = uVar39;
  puVar1 = (uint *)((long)&pnVar16[lVar25].m_backend.data + 0x10);
  *puVar1 = uVar32;
  puVar1[1] = uVar33;
  puVar1[2] = uVar34;
  puVar1[3] = uVar35;
  pnVar3 = pnVar16 + lVar25;
  (pnVar3->m_backend).data._M_elems[0] = uVar28;
  *(uint *)((long)&(pnVar3->m_backend).data + 4) = uVar29;
  *(uint *)((long)&(pnVar3->m_backend).data + 8) = uVar30;
  *(uint *)((long)&(pnVar3->m_backend).data + 0xc) = uVar31;
  pnVar16[lVar25].m_backend.exp = (leavebound->m_backend).exp;
  pnVar16[lVar25].m_backend.neg = (leavebound->m_backend).neg;
  iVar24 = (leavebound->m_backend).prec_elem;
  pnVar16[lVar25].m_backend.fpclass = (leavebound->m_backend).fpclass;
  pnVar16[lVar25].m_backend.prec_elem = iVar24;
  SVar13 = SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ::dualColStatus(&this->
                            super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           ,iVar12);
  (this->
  super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).thedesc.colstat.data[lVar25] = SVar13;
  if (SVar13 == D_ON_BOTH) {
    local_138.fpclass = cpp_dec_float_finite;
    local_138.prec_elem = 0x10;
    local_138.data._M_elems[0] = 0;
    local_138.data._M_elems[1] = 0;
    local_138.data._M_elems[2] = 0;
    local_138.data._M_elems[3] = 0;
    local_138.data._M_elems[4] = 0;
    local_138.data._M_elems[5] = 0;
    local_138.data._M_elems[6] = 0;
    local_138.data._M_elems[7] = 0;
    local_138.data._M_elems[8] = 0;
    local_138.data._M_elems[9] = 0;
    local_138.data._M_elems[10] = 0;
    local_138.data._M_elems[0xb] = 0;
    local_138.data._M_elems[0xc] = 0;
    local_138.data._M_elems[0xd] = 0;
    local_138.data._M_elems._56_5_ = 0;
    local_138.data._M_elems[0xf]._1_3_ = 0;
    local_138.exp = 0;
    local_138.neg = false;
    boost::multiprecision::default_ops::
    eval_multiply<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
              (&local_138,
               &(this->theLCbound).val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start[lVar25].m_backend,
               &(this->
                super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .up.val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start[lVar25].m_backend);
    pcVar17 = local_e0;
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=(local_e0,&local_138)
    ;
    local_138.fpclass = cpp_dec_float_finite;
    local_138.prec_elem = 0x10;
    local_138.data._M_elems[0] = 0;
    local_138.data._M_elems[1] = 0;
    local_138.data._M_elems[2] = 0;
    local_138.data._M_elems[3] = 0;
    local_138.data._M_elems[4] = 0;
    local_138.data._M_elems[5] = 0;
    local_138.data._M_elems[6] = 0;
    local_138.data._M_elems[7] = 0;
    local_138.data._M_elems[8] = 0;
    local_138.data._M_elems[9] = 0;
    local_138.data._M_elems[10] = 0;
    local_138.data._M_elems[0xb] = 0;
    local_138.data._M_elems[0xc] = 0;
    local_138.data._M_elems[0xd] = 0;
    local_138.data._M_elems._56_5_ = 0;
    local_138.data._M_elems[0xf]._1_3_ = 0;
    local_138.exp = 0;
    local_138.neg = false;
    boost::multiprecision::default_ops::
    eval_multiply<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
              (&local_138,
               &(this->theUCbound).val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start[lVar25].m_backend,
               &(this->
                super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .low.val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start[lVar25].m_backend);
  }
  else {
    if (SVar13 == D_ON_LOWER) {
      pnVar3 = (this->theLCbound).val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pnVar16 = (this->
                super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .up.val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
    }
    else {
      if (SVar13 != D_ON_UPPER) {
        return;
      }
      pnVar3 = (this->theUCbound).val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pnVar16 = (this->
                super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .low.val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
    }
    local_138.fpclass = cpp_dec_float_finite;
    local_138.prec_elem = 0x10;
    local_138.data._M_elems[0] = 0;
    local_138.data._M_elems[1] = 0;
    local_138.data._M_elems[2] = 0;
    local_138.data._M_elems[3] = 0;
    local_138.data._M_elems[4] = 0;
    local_138.data._M_elems[5] = 0;
    local_138.data._M_elems[6] = 0;
    local_138.data._M_elems[7] = 0;
    local_138.data._M_elems[8] = 0;
    local_138.data._M_elems[9] = 0;
    local_138.data._M_elems[10] = 0;
    local_138.data._M_elems[0xb] = 0;
    local_138.data._M_elems[0xc] = 0;
    local_138.data._M_elems[0xd] = 0;
    local_138.data._M_elems._56_5_ = 0;
    local_138.data._M_elems[0xf]._1_3_ = 0;
    local_138.exp = 0;
    local_138.neg = false;
    boost::multiprecision::default_ops::
    eval_multiply<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
              (&local_138,(cpp_dec_float<100U,_int,_void> *)((long)pnVar3 + lVar25 * 0x50),
               (cpp_dec_float<100U,_int,_void> *)((long)pnVar16 + lVar25 * 0x50));
    pcVar17 = local_e0;
  }
LAB_003a3a60:
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=(pcVar17,&local_138);
  return;
}

Assistant:

void SPxSolverBase<R>::getEnterVals2
(
   int leaveIdx,
   R enterMax,
   R& leavebound,
   StableSum<R>& objChange
)
{
   int idx;
   typename SPxBasisBase<R>::Desc& ds = this->desc();
   SPxId leftId = this->baseId(leaveIdx);

   if(leftId.isSPxRowId())
   {
      idx = this->number(SPxRowId(leftId));
      typename SPxBasisBase<R>::Desc::Status leaveStat = ds.rowStatus(idx);

      // coverity[switch_selector_expr_is_constant]
      switch(leaveStat)
      {
      case SPxBasisBase<R>::Desc::P_FIXED :
         assert(rep() == ROW);
         throw SPxInternalCodeException("XENTER04 This should never happen.");
         break;

      case SPxBasisBase<R>::Desc::P_ON_UPPER :
         assert(rep() == ROW);
         leavebound = theLBbound[leaveIdx];
         theLRbound[idx] = leavebound;
         ds.rowStatus(idx) = this->dualRowStatus(idx);

         switch(ds.rowStatus(idx))
         {
         case SPxBasisBase<R>::Desc::D_ON_UPPER :
            objChange += theURbound[idx] * this->lhs(idx);
            break;

         case SPxBasisBase<R>::Desc::D_ON_LOWER :
            objChange += theLRbound[idx] * this->rhs(idx);
            break;

         case SPxBasisBase<R>::Desc::D_ON_BOTH :
            objChange += theURbound[idx] * this->lhs(idx);
            objChange += theLRbound[idx] * this->rhs(idx);
            break;

         default:
            break;
         }

         break;

      case SPxBasisBase<R>::Desc::P_ON_LOWER :
         assert(rep() == ROW);
         leavebound = theUBbound[leaveIdx];
         theURbound[idx] = leavebound;
         ds.rowStatus(idx) = this->dualRowStatus(idx);

         switch(ds.rowStatus(idx))
         {
         case SPxBasisBase<R>::Desc::D_ON_UPPER :
            objChange += theURbound[idx] * this->lhs(idx);
            break;

         case SPxBasisBase<R>::Desc::D_ON_LOWER :
            objChange += theLRbound[idx] * this->rhs(idx);
            break;

         case SPxBasisBase<R>::Desc::D_ON_BOTH :
            objChange += theURbound[idx] * this->lhs(idx);
            objChange += theLRbound[idx] * this->rhs(idx);
            break;

         default:
            break;
         }

         break;

      case SPxBasisBase<R>::Desc::P_FREE :
         assert(rep() == ROW);
#if 1
         throw SPxInternalCodeException("XENTER05 This should never happen.");
#else
         SPX_MSG_ERROR(std::cerr << "EENTER98 ERROR: not yet debugged!" << std::endl;)

         if((*theCoPvec)[leaveIdx] - theLBbound[leaveIdx] <
               theUBbound[leaveIdx] - (*theCoPvec)[leaveIdx])
         {
            leavebound = theLBbound[leaveIdx];
            theLRbound[idx] = leavebound;
         }
         else
         {
            leavebound = theUBbound[leaveIdx];
            theURbound[idx] = leavebound;
         }

         ds.rowStatus(idx) = SPxBasisBase<R>::Desc::D_UNDEFINED;
#endif
         break;

      // primal/columnwise cases:
      case SPxBasisBase<R>::Desc::D_UNDEFINED :
         assert(rep() == COLUMN);
         throw SPxInternalCodeException("XENTER06 This should never happen.");
         break;

      case SPxBasisBase<R>::Desc::D_FREE :
         assert(rep() == COLUMN);

         if(theFvec->delta()[leaveIdx] * enterMax < 0)
            leavebound = theUBbound[leaveIdx];
         else
            leavebound = theLBbound[leaveIdx];

         theLRbound[idx] = leavebound;
         theURbound[idx] = leavebound;
         objChange += leavebound * this->maxRowObj(leaveIdx);
         ds.rowStatus(idx) = SPxBasisBase<R>::Desc::P_FIXED;
         break;

      case SPxBasisBase<R>::Desc::D_ON_UPPER :
         assert(rep() == COLUMN);
         leavebound = theUBbound[leaveIdx];
         theURbound[idx] = leavebound;
         objChange += leavebound * this->maxRowObj(leaveIdx);
         ds.rowStatus(idx) = SPxBasisBase<R>::Desc::P_ON_LOWER;
         break;

      case SPxBasisBase<R>::Desc::D_ON_LOWER :
         assert(rep() == COLUMN);
         leavebound = theLBbound[leaveIdx];
         theLRbound[idx] = leavebound;
         objChange += leavebound * this->maxRowObj(leaveIdx);
         ds.rowStatus(idx) = SPxBasisBase<R>::Desc::P_ON_UPPER;
         break;

      case SPxBasisBase<R>::Desc::D_ON_BOTH :
         assert(rep() == COLUMN);

         if(enterMax * theFvec->delta()[leaveIdx] < 0)
         {
            leavebound = theUBbound[leaveIdx];
            theURbound[idx] = leavebound;
            objChange += leavebound * this->maxRowObj(leaveIdx);
            ds.rowStatus(idx) = SPxBasisBase<R>::Desc::P_ON_LOWER;
         }
         else
         {
            leavebound = theLBbound[leaveIdx];
            theLRbound[idx] = leavebound;
            objChange += leavebound * this->maxRowObj(leaveIdx);
            ds.rowStatus(idx) = SPxBasisBase<R>::Desc::P_ON_UPPER;
         }

         break;

      default:
         throw SPxInternalCodeException("XENTER07 This should never happen.");
      }

      SPxOut::debug(this, "DENTER06 SPxSolverBase::getEnterVals2(): row {}: {} -> {} objChange: {}\n",
                    idx, leaveStat, ds.rowStatus(idx), objChange);
   }

   else
   {
      assert(leftId.isSPxColId());
      idx = this->number(SPxColId(leftId));
      typename SPxBasisBase<R>::Desc::Status leaveStat = ds.colStatus(idx);

      // coverity[switch_selector_expr_is_constant]
      switch(leaveStat)
      {
      case SPxBasisBase<R>::Desc::P_ON_UPPER :
         assert(rep() == ROW);
         leavebound = theLBbound[leaveIdx];
         theLCbound[idx] = leavebound;
         ds.colStatus(idx) = this->dualColStatus(idx);

         switch(ds.colStatus(idx))
         {
         case SPxBasisBase<R>::Desc::D_ON_UPPER :
            objChange += theUCbound[idx] * this->lower(idx);
            break;

         case SPxBasisBase<R>::Desc::D_ON_LOWER :
            objChange += theLCbound[idx] * this->upper(idx);
            break;

         case SPxBasisBase<R>::Desc::D_ON_BOTH :
            objChange += theLCbound[idx] * this->upper(idx);
            objChange += theUCbound[idx] * this->lower(idx);
            break;

         default:
            break;
         }

         break;

      case SPxBasisBase<R>::Desc::P_ON_LOWER :
         assert(rep() == ROW);
         leavebound = theUBbound[leaveIdx];
         theUCbound[idx] = leavebound;
         ds.colStatus(idx) = this->dualColStatus(idx);

         switch(ds.colStatus(idx))
         {
         case SPxBasisBase<R>::Desc::D_ON_UPPER :
            objChange += theUCbound[idx] * this->lower(idx);
            break;

         case SPxBasisBase<R>::Desc::D_ON_LOWER :
            objChange += theLCbound[idx] * this->upper(idx);
            break;

         case SPxBasisBase<R>::Desc::D_ON_BOTH :
            objChange += theLCbound[idx] * this->upper(idx);
            objChange += theUCbound[idx] * this->lower(idx);
            break;

         default:
            break;
         }

         break;

      case SPxBasisBase<R>::Desc::P_FREE :
         assert(rep() == ROW);

         if(theFvec->delta()[leaveIdx] * enterMax > 0)
         {
            leavebound = theLBbound[leaveIdx];
            theLCbound[idx] = leavebound;
         }
         else
         {
            leavebound = theUBbound[leaveIdx];
            theUCbound[idx] = leavebound;
         }

         ds.colStatus(idx) = SPxBasisBase<R>::Desc::D_UNDEFINED;
         break;

      case SPxBasisBase<R>::Desc::P_FIXED:
         assert(rep() == ROW);
         throw SPxInternalCodeException("XENTER08 This should never happen.");
         break;

      // primal/columnwise cases:
      case SPxBasisBase<R>::Desc::D_FREE :
         assert(rep() == COLUMN);

         if(theFvec->delta()[leaveIdx] * enterMax > 0)
            leavebound = theLBbound[leaveIdx];
         else
            leavebound = theUBbound[leaveIdx];

         theUCbound[idx] =
            theLCbound[idx] = leavebound;
         objChange += this->maxObj(idx) * leavebound;
         ds.colStatus(idx) = SPxBasisBase<R>::Desc::P_FIXED;
         break;

      case SPxBasisBase<R>::Desc::D_ON_UPPER :
         assert(rep() == COLUMN);
         leavebound = theLBbound[leaveIdx];
         theLCbound[idx] = leavebound;
         objChange += this->maxObj(idx) * leavebound;
         ds.colStatus(idx) = SPxBasisBase<R>::Desc::P_ON_LOWER;
         break;

      case SPxBasisBase<R>::Desc::D_ON_LOWER :
         assert(rep() == COLUMN);
         leavebound = theUBbound[leaveIdx];
         theUCbound[idx] = leavebound;
         objChange += this->maxObj(idx) * leavebound;
         ds.colStatus(idx) = SPxBasisBase<R>::Desc::P_ON_UPPER;
         break;

      case SPxBasisBase<R>::Desc::D_ON_BOTH :
      case SPxBasisBase<R>::Desc::D_UNDEFINED :
         assert(rep() == COLUMN);

         if(enterMax * theFvec->delta()[leaveIdx] < 0)
         {
            leavebound = theUBbound[leaveIdx];
            theUCbound[idx] = leavebound;
            objChange += this->maxObj(idx) * leavebound;
            ds.colStatus(idx) = SPxBasisBase<R>::Desc::P_ON_UPPER;
         }
         else
         {
            leavebound = theLBbound[leaveIdx];
            theLCbound[idx] = leavebound;
            objChange += this->maxObj(idx) * leavebound;
            ds.colStatus(idx) = SPxBasisBase<R>::Desc::P_ON_LOWER;
         }

         break;

      default:
         throw SPxInternalCodeException("XENTER09 This should never happen.");
      }

      SPxOut::debug(this, "DENTER07 SPxSolverBase::getEnterVals2(): col {}: {} -> {} objChange: {}\n",
                    idx, leaveStat, ds.colStatus(idx), objChange);
   }
}